

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O3

Matrix4d *
opengv::relative_pose::modules::ge::composeGwithJacobians
          (Matrix4d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,Matrix<double,_3,_9,_0,_3,_9> *x1P,
          Matrix<double,_3,_9,_0,_3,_9> *y1P,Matrix<double,_3,_9,_0,_3,_9> *z1P,
          Matrix<double,_3,_9,_0,_3,_9> *x2P,Matrix<double,_3,_9,_0,_3,_9> *y2P,
          Matrix<double,_3,_9,_0,_3,_9> *z2P,Matrix<double,_9,_9,_0,_9,_9> *m11P,
          Matrix<double,_9,_9,_0,_9,_9> *m12P,Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,
          Matrix4d *G_jac1,Matrix4d *G_jac2,Matrix4d *G_jac3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  double dVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  SrcEvaluatorType **ppSVar136;
  undefined1 auVar137 [64];
  ActualDstType actualDst;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  double dVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  double dVar171;
  double dVar172;
  double dVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  double dVar384;
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  double dVar558;
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  DstEvaluatorType dstEvaluator;
  Matrix<double,_9,_1,_0,_9,_1> Cols;
  Matrix<double,_1,_9,_1,_1,_9> Rows;
  rotation_t R_jac3;
  rotation_t R_jac2;
  rotation_t R_jac1;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac3;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac2;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac1;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac3;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac2;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac1;
  plainobjectbase_evaluator_data<double,_0> local_578;
  Scalar local_570;
  plainobjectbase_evaluator_data<double,_0> local_568;
  double local_560;
  SrcEvaluatorType *local_558;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_550;
  Matrix4d *local_530;
  double local_528;
  double dStack_520;
  double dStack_518;
  double dStack_510;
  double dStack_508;
  double dStack_500;
  double dStack_4f8;
  double dStack_4f0;
  double local_4e8;
  Matrix<double,_9,_1,_0,_9,_1> local_4d8;
  Matrix<double,_9,_1,_0,_9,_1> local_488;
  Matrix3d *local_440;
  ulong local_438;
  undefined8 local_430;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  undefined8 uStack_3d0;
  double dStack_3c8;
  undefined8 uStack_3c0;
  double dStack_3b8;
  double dStack_3b0;
  double dStack_3a8;
  double dStack_3a0;
  double dStack_398;
  double local_388;
  double dStack_380;
  undefined8 uStack_378;
  double dStack_370;
  double dStack_368;
  double dStack_360;
  double dStack_358;
  double dStack_350;
  double dStack_348;
  double local_338;
  double dStack_330;
  double dStack_328;
  double dStack_320;
  double dStack_318;
  undefined8 uStack_310;
  double dStack_308;
  double dStack_300;
  double local_2f8;
  undefined1 local_2f0 [40];
  undefined8 local_2c8;
  Matrix<double,_3,_9,_0,_3,_9> *local_2c0;
  double *local_2b8;
  Matrix<double,_3,_9,_0,_3,_9> *local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  double local_288;
  undefined8 uStack_280;
  double local_278;
  undefined8 uStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double dStack_248;
  double dStack_240;
  double local_238;
  double dStack_230;
  double local_228;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double dStack_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  Matrix<double,_9,_1,_0,_9,_1> local_178;
  Matrix<double,_9,_1,_0,_9,_1> local_128;
  Matrix<double,_9,_1,_0,_9,_1> local_d8;
  DstXprType *local_88;
  undefined1 local_80 [64];
  undefined8 local_40;
  Matrix<double,_9,_1,_0,_9,_1> *local_38;
  
  local_530 = __return_storage_ptr__;
  local_440 = yyF;
  math::cayley2rot_reduced(cayley);
  auVar141 = *(undefined1 (*) [16])
              (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array;
  dVar171 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[2];
  auVar164 = ZEXT816(0xc000000000000000);
  auVar138 = vaddpd_avx512vl(auVar141,auVar141);
  dStack_318 = auVar141._0_8_ * -2.0;
  auVar174._8_8_ = auVar141._8_8_;
  auVar174._0_8_ = dVar171;
  auVar139 = vmulpd_avx512vl(auVar174,_DAT_0025d2c0);
  local_558 = (SrcEvaluatorType *)(dVar171 * -2.0);
  local_338 = auVar138._0_8_;
  dStack_330 = auVar138._8_8_;
  dStack_300 = -2.0;
  auVar140 = vshufpd_avx512vl(auVar138,auVar138,1);
  dStack_358 = 2.0;
  uStack_310 = 0x4000000000000000;
  uStack_378 = 0xc000000000000000;
  uStack_3c0 = 0xc000000000000000;
  uStack_3d0 = 0x4000000000000000;
  dStack_3c8 = (double)vmovlpd_avx512f(auVar138);
  dStack_3b0 = auVar140._0_8_;
  dStack_3a8 = auVar140._8_8_;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = dStack_500;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dStack_518;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = dStack_520;
  dStack_350 = auVar139._0_8_;
  dStack_308 = (double)vmovlpd_avx512f(auVar139);
  auVar141 = vshufpd_avx512vl(auVar138,auVar139,1);
  auVar142 = vmulsd_avx512f(auVar139,auVar164);
  dStack_320 = dStack_330;
  auVar143 = vshufpd_avx512vl(auVar139,auVar138,1);
  dStack_3a0 = auVar141._0_8_;
  dStack_398 = auVar141._8_8_;
  local_388 = auVar143._0_8_;
  dStack_380 = auVar143._8_8_;
  local_420 = (double)vmovlpd_avx512f(auVar139);
  dStack_348 = auVar139._8_8_;
  auVar175 = ZEXT816(0x4000000000000000);
  dVar171 = (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
            m_data.array[1];
  auVar546._8_8_ = 0;
  auVar546._0_8_ = dVar171;
  auVar567._8_8_ = 0;
  auVar567._0_8_ =
       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[2];
  dVar384 = (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
            m_data.array[0];
  auVar562._8_8_ = 0;
  auVar562._0_8_ = dVar384;
  auVar581._8_8_ = 0;
  auVar581._0_8_ =
       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[5];
  dVar172 = (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
            m_data.array[4];
  auVar576._8_8_ = 0;
  auVar576._0_8_ = dVar172;
  dVar173 = (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
            m_data.array[3];
  auVar572._8_8_ = 0;
  auVar572._0_8_ = dVar173;
  auVar144 = vmulsd_avx512f(auVar175,auVar164);
  local_430 = 0x4000000000000000;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = local_4e8;
  auVar145 = vmulsd_avx512f(auVar588,auVar567);
  auVar146 = vmulsd_avx512f(auVar588,auVar581);
  auVar589._8_8_ = 0;
  auVar589._0_8_ = local_4e8;
  auVar596._8_8_ = 0;
  auVar596._0_8_ =
       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[8];
  auVar147 = vmulsd_avx512f(auVar589,auVar596);
  auVar592._8_8_ = 0;
  auVar592._0_8_ =
       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[7];
  auVar148 = vmulsd_avx512f(auVar228,auVar592);
  auVar584._8_8_ = 0;
  auVar584._0_8_ =
       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[6];
  auVar149 = vmulsd_avx512f(auVar240,auVar584);
  auVar150 = vmulsd_avx512f(auVar589,auVar164);
  auVar141._8_8_ = 0;
  auVar141._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar141 = vmulsd_avx512f(auVar150,auVar141);
  auVar151._8_8_ = 0;
  auVar151._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar151 = vmulsd_avx512f(auVar150,auVar151);
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar152 = vmulsd_avx512f(auVar150,auVar152);
  auVar474._8_8_ = 0;
  auVar474._0_8_ = auVar148._0_8_ + auVar147._0_8_ + auVar149._0_8_;
  auVar147 = vmulsd_avx512f(auVar589,auVar474);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dStack_518 * (dVar384 * dStack_518 + dVar171 * dStack_500 + auVar145._0_8_);
  auVar316._8_8_ = 0;
  auVar316._0_8_ =
       dStack_500 * (dVar173 * dStack_518 + auVar146._0_8_ + dVar172 * dStack_500) + auVar147._0_8_;
  auVar153 = vaddsd_avx512f(auVar157,auVar316);
  dVar163 = dStack_500 * -2.0;
  dVar91 = dStack_518 * -2.0;
  auVar541._8_8_ = 0;
  auVar541._0_8_ =
       dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1];
  auVar141 = vaddsd_avx512f(auVar541,auVar141);
  auVar145._8_8_ = 0;
  auVar145._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = dVar163;
  auVar145 = vmulsd_avx512f(auVar317,auVar145);
  auVar151 = vaddsd_avx512f(auVar145,auVar151);
  auVar146._8_8_ = 0;
  auVar146._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar145 = vmulsd_avx512f(auVar317,auVar146);
  auVar542._8_8_ = 0;
  auVar542._0_8_ =
       dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3];
  auVar151 = vaddsd_avx512f(auVar542,auVar151);
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar91;
  auVar146 = vmulsd_avx512f(auVar158,auVar147);
  auVar152 = vaddsd_avx512f(auVar145,auVar152);
  auVar152 = vaddsd_avx512f(auVar146,auVar152);
  auVar475._8_8_ = 0;
  auVar475._0_8_ =
       auVar141._0_8_ +
       dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0];
  auVar141 = vmulsd_avx512f(auVar475,auVar385);
  auVar476._8_8_ = 0;
  auVar476._0_8_ = dStack_508;
  auVar151 = vmulsd_avx512f(auVar151,auVar476);
  auVar543._8_8_ = 0;
  auVar543._0_8_ = dStack_4f0;
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar145 = vmulsd_avx512f(auVar543,auVar148);
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar146 = vmulsd_avx512f(auVar543,auVar149);
  auVar152 = vmulsd_avx512f(auVar152,auVar543);
  auVar151 = vaddsd_avx512f(auVar151,auVar152);
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar152 = vmulsd_avx512f(auVar543,auVar154);
  auVar141 = vaddsd_avx512f(auVar141,auVar151);
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar151 = vmulsd_avx512f(auVar476,auVar155);
  auVar141 = vaddsd_avx512f(auVar153,auVar141);
  auVar153._8_8_ = 0;
  auVar153._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar147 = vmulsd_avx512f(auVar385,auVar153);
  auVar151 = vaddsd_avx512f(auVar151,auVar152);
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar152 = vmulsd_avx512f(auVar476,auVar156);
  auVar151 = vaddsd_avx512f(auVar147,auVar151);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar147 = vmulsd_avx512f(auVar385,auVar1);
  auVar151 = vmulsd_avx512f(auVar385,auVar151);
  auVar152 = vaddsd_avx512f(auVar152,auVar145);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7];
  auVar145 = vmulsd_avx512f(auVar476,auVar2);
  auVar152 = vaddsd_avx512f(auVar147,auVar152);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6];
  auVar147 = vmulsd_avx512f(auVar385,auVar3);
  auVar152 = vmulsd_avx512f(auVar476,auVar152);
  auVar145 = vaddsd_avx512f(auVar145,auVar146);
  auVar145 = vaddsd_avx512f(auVar147,auVar145);
  auVar145 = vmulsd_avx512f(auVar543,auVar145);
  auVar152 = vaddsd_avx512f(auVar152,auVar145);
  auVar151 = vaddsd_avx512f(auVar151,auVar152);
  auVar141 = vaddsd_avx512f(auVar141,auVar151);
  auVar151 = vaddsd_avx512f(auVar175,auVar175);
  auVar606._8_8_ = 0;
  auVar606._0_8_ = dStack_318;
  auVar152 = vaddsd_avx512f(auVar606,auVar606);
  auVar607._8_8_ = 0;
  auVar607._0_8_ = dStack_318;
  auVar145 = vmulsd_avx512f(auVar607,auVar164);
  vmovsd_avx512f(auVar607);
  vmovsd_avx512f(auVar141);
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0] = (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[0];
  auVar141 = vaddsd_avx512f(auVar139,auVar139);
  auVar146 = vmulsd_avx512f(auVar546,auVar151);
  auVar147 = vmulsd_avx512f(auVar567,auVar152);
  auVar148 = vmulsd_avx512f(auVar141,auVar562);
  auVar149 = vmulsd_avx512f(auVar576,auVar151);
  auVar154 = vmulsd_avx512f(auVar596,auVar152);
  auVar155 = vmulsd_avx512f(auVar141,auVar572);
  auVar152 = vmulsd_avx512f(auVar581,auVar152);
  auVar151 = vmulsd_avx512f(auVar592,auVar151);
  auVar141 = vmulsd_avx512f(auVar141,auVar584);
  auVar568._8_8_ = 0;
  auVar568._0_8_ = auVar141._0_8_ + auVar151._0_8_ + auVar154._0_8_;
  auVar141 = vmulsd_avx512f(auVar589,auVar568);
  dVar171 = (auVar148._0_8_ + auVar146._0_8_ + auVar147._0_8_) * dStack_518 +
            (auVar155._0_8_ + auVar149._0_8_ + auVar152._0_8_) * dStack_500 + auVar141._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar171;
  auVar175._8_8_ = 0;
  auVar175._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar141 = vmulsd_avx512f(auVar144,auVar175);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar151 = vmulsd_avx512f(auVar145,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0];
  auVar152 = vmulsd_avx512f(auVar142,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar146 = vmulsd_avx512f(auVar145,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar147 = vmulsd_avx512f(auVar145,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar148 = vmulsd_avx512f(auVar144,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar149 = vmulsd_avx512f(auVar142,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar154 = vmulsd_avx512f(auVar144,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar155 = vmulsd_avx512f(auVar142,auVar11);
  dVar171 = dVar171 + (auVar152._0_8_ + auVar141._0_8_ + auVar151._0_8_) * dStack_520 +
                      (auVar149._0_8_ + auVar148._0_8_ + auVar146._0_8_) * dStack_508 +
                      dStack_4f0 * (auVar155._0_8_ + auVar154._0_8_ + auVar147._0_8_);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar171;
  dVar558 = auVar150._0_8_;
  local_298 = 0xc000000000000000;
  uStack_290 = 0;
  auVar563._8_8_ = 0;
  auVar563._0_8_ =
       dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0] +
       dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
       dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar141 = vmulsd_avx512f(auVar140,auVar563);
  auVar569._8_8_ = 0;
  auVar569._0_8_ =
       dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3] +
       dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
       dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar608._8_8_ = 0;
  auVar608._0_8_ = dStack_318;
  auVar151 = vmulsd_avx512f(auVar569,auVar608);
  auVar609._8_8_ = 0;
  auVar609._0_8_ = dStack_318;
  auVar152 = vaddsd_avx512f(auVar608,auVar609);
  dVar171 = dVar171 + auVar141._0_8_ +
                      auVar151._0_8_ +
                      (dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] +
                      dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * -2.0;
  auVar141 = vaddsd_avx512f(auVar140,auVar140);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar171;
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar151 = vmulsd_avx512f(ZEXT816(0xc010000000000000),auVar150);
  dVar384 = auVar141._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar141 = vmulsd_avx512f(ZEXT816(0xc010000000000000),auVar12);
  auVar577._8_8_ = 0;
  auVar577._0_8_ =
       auVar152._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar151 = vaddsd_avx512f(auVar577,auVar151);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar146 = vmulsd_avx512f(auVar152,auVar13);
  auVar141 = vaddsd_avx512f(auVar146,auVar141);
  auVar578._8_8_ = 0;
  auVar578._0_8_ =
       dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar141 = vaddsd_avx512f(auVar578,auVar141);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar171 + (dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[0] + auVar151._0_8_) * dStack_520 +
                 auVar141._0_8_ * dStack_508 +
                 dStack_4f0 *
                 (dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[6] +
                 auVar152._0_8_ *
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8] * -4.0);
  auVar579._8_8_ = 0;
  auVar579._0_8_ = dStack_348;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[0];
  auVar141 = vmulsd_avx512f(ZEXT816(0x4010000000000000),auVar14);
  dVar171 = local_420 + local_420;
  dVar384 = dStack_348 + dStack_348;
  local_428 = dStack_348;
  local_410 = local_420 * -2.0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[3];
  auVar151 = vmulsd_avx512f(ZEXT816(0x4010000000000000),auVar15);
  auVar152 = vmulsd_avx512f(auVar579,auVar164);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[6];
  auVar147 = ZEXT816(0x4010000000000000);
  auVar146 = vmulsd_avx512f(auVar147,auVar16);
  local_418 = auVar152._0_8_;
  auVar564._8_8_ = 0;
  auVar564._0_8_ =
       (dVar171 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                  m_storage.m_data.array[7] +
       dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array[8]) - auVar146._0_8_;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = local_4e8;
  auVar152 = vmulsd_avx512f(auVar590,auVar564);
  dVar384 = ((dVar171 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[1] +
             dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[2]) - auVar141._0_8_) * dStack_518 +
            ((dVar171 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[4] +
             dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[5]) - auVar151._0_8_) * dStack_500 + auVar152._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar384;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar141 = vmulsd_avx512f(auVar147,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar151 = vmulsd_avx512f(auVar147,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar152 = vmulsd_avx512f(auVar147,auVar19);
  dVar384 = dVar384 + (auVar141._0_8_ +
                      local_410 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
                      local_418 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * dStack_520 +
                      (auVar151._0_8_ +
                      local_410 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
                      local_418 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * dStack_508 +
                      dStack_4f0 *
                      (auVar152._0_8_ +
                      local_410 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      local_418 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar384;
  uStack_280 = 0;
  auVar565._8_8_ = 0;
  auVar565._0_8_ =
       dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0] +
       dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
       dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar141 = vmulsd_avx512f(auVar138,auVar565);
  auVar570._8_8_ = 0;
  auVar570._0_8_ =
       dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3] +
       dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
       dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar603._8_8_ = 0;
  auVar603._0_8_ = dStack_330;
  auVar151 = vmulsd_avx512f(auVar570,auVar603);
  dVar171 = dStack_350 + dStack_350;
  dVar384 = dVar384 + auVar141._0_8_ +
                      auVar151._0_8_ +
                      (dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] +
                      dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * dStack_350;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = dStack_330;
  auVar141 = vaddsd_avx512f(auVar603,auVar604);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar384;
  dVar172 = auVar141._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = dVar171;
  auVar141 = vmulsd_avx512f(auVar573,auVar20);
  auVar151 = vaddsd_avx512f(auVar138,auVar138);
  dVar173 = auVar151._0_8_;
  auVar582._8_8_ = 0;
  auVar582._0_8_ =
       dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar141 = vaddsd_avx512f(auVar582,auVar141);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar151 = vmulsd_avx512f(auVar151,auVar21);
  auVar141 = vaddsd_avx512f(auVar151,auVar141);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar384 + (dVar173 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[0] +
                 dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[1] +
                 dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2]) * dStack_520 +
                 auVar141._0_8_ * dStack_508 +
                 dStack_4f0 *
                 (dVar173 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[6] +
                 dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[7] +
                 dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8]);
  auVar574._8_8_ = 0;
  auVar574._0_8_ = dStack_398;
  dVar171 = dStack_3b0 + dStack_3b0;
  dVar384 = dStack_398 + dStack_398;
  local_408 = dStack_398;
  local_400 = dStack_3b0;
  local_3e0 = dStack_3b0 * -2.0;
  auVar141 = vmulsd_avx512f(auVar574,auVar164);
  auVar151 = vmulsd_avx512f(auVar138,auVar164);
  local_3e8 = auVar141._0_8_;
  local_3f0 = auVar151._0_8_;
  auVar547._8_8_ = 0;
  auVar547._0_8_ =
       dVar173 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array[6] +
       dVar171 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array[7] +
       dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                 .m_data.array[8];
  auVar141 = vmulsd_avx512f(auVar590,auVar547);
  dVar173 = (dVar173 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[0] +
            dVar171 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[1] +
            dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[2]) * dStack_518 +
            (dVar173 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[3] +
            dVar171 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[4] +
            dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[5]) * dStack_500 + auVar141._0_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar173;
  dVar173 = dVar173 + (local_3f0 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      local_3e0 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
                      local_3e8 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * dStack_520 +
                      (local_3f0 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
                      local_3e0 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
                      local_3e8 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * dStack_508 +
                      dStack_4f0 *
                      (local_3f0 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      local_3e0 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      local_3e8 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar173;
  local_278 = dStack_3a0;
  uStack_270 = 0;
  dVar171 = dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[0] +
            dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
            dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2];
  dVar384 = dStack_3a0 + dStack_3a0;
  dVar172 = (double)local_558 + (double)local_558;
  dVar173 = dVar173 + dVar171 + dVar171 +
                      (dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3] +
                      dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * (double)local_558 +
                      dStack_3a0 *
                      (dVar91 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] +
                      dVar558 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8] +
                      dVar163 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar173;
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar152 = ZEXT816(0x4010000000000000);
  auVar141 = vmulsd_avx512f(auVar152,auVar164);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar151 = vmulsd_avx512f(auVar152,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar152 = vmulsd_avx512f(auVar152,auVar23);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar173 + (auVar141._0_8_ +
                 dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[1] +
                 dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2]) * dStack_520 +
                 (auVar151._0_8_ +
                 dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[4] +
                 dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[5]) * dStack_508 +
                 dStack_4f0 *
                 (auVar152._0_8_ +
                 dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8] +
                 dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[7]);
  auVar583._8_8_ = 0;
  auVar583._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  dVar171 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar171;
  auVar571._8_8_ = 0;
  auVar571._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  dVar384 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4];
  auVar575._8_8_ = 0;
  auVar575._0_8_ = dVar384;
  dVar172 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar566._8_8_ = 0;
  auVar566._0_8_ = dVar172;
  dVar173 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7];
  auVar559._8_8_ = 0;
  auVar559._0_8_ = dVar173;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar141 = vmulsd_avx512f(auVar228,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar151 = vmulsd_avx512f(auVar228,auVar25);
  auVar585._8_8_ = 0;
  auVar585._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar152 = vmulsd_avx512f(auVar228,auVar585);
  auVar146 = vmulsd_avx512f(auVar590,auVar583);
  auVar147 = vmulsd_avx512f(auVar590,auVar571);
  auVar148 = vmulsd_avx512f(auVar139,auVar566);
  auVar318._8_8_ = 0;
  auVar318._0_8_ = auVar147._0_8_ + dVar384 * dStack_500;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = dVar172 * dStack_518;
  auVar147 = vaddsd_avx512f(auVar548,auVar318);
  auVar549._8_8_ = 0;
  auVar549._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar149 = vmulsd_avx512f(auVar590,auVar549);
  auVar319._8_8_ = 0;
  auVar319._0_8_ = dVar173 * dStack_500;
  auVar149 = vaddsd_avx512f(auVar319,auVar149);
  auVar320._8_8_ = 0;
  auVar320._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar154 = vmulsd_avx512f(auVar240,auVar320);
  auVar155 = vmulsd_avx512f(auVar139,auVar320);
  auVar149 = vaddsd_avx512f(auVar154,auVar149);
  auVar600._8_8_ = 0;
  auVar600._0_8_ = dStack_510;
  auVar147 = vmulsd_avx512f(auVar147,auVar600);
  auVar597._8_8_ = 0;
  auVar597._0_8_ = dStack_4f8;
  auVar149 = vmulsd_avx512f(auVar149,auVar597);
  auVar147 = vaddsd_avx512f(auVar147,auVar149);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar171 * dStack_518 + auVar152._0_8_ + auVar146._0_8_;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = local_528;
  auVar152 = vmulsd_avx512f(auVar165,auVar593);
  auVar159._8_8_ = 0x8000000000000000;
  auVar159._0_8_ = 0x8000000000000000;
  auVar146 = vxorpd_avx512vl(auVar590,auVar159);
  auVar160._8_8_ = 0;
  auVar160._0_8_ =
       auVar146._0_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar141 = vsubsd_avx512f(auVar160,auVar141);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar149 = vmulsd_avx512f(auVar240,auVar26);
  auVar141 = vsubsd_avx512f(auVar141,auVar149);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar149 = vmulsd_avx512f(auVar146,auVar27);
  auVar151 = vsubsd_avx512f(auVar149,auVar151);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar149 = vmulsd_avx512f(auVar240,auVar28);
  auVar151 = vsubsd_avx512f(auVar151,auVar149);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar149 = vmulsd_avx512f(auVar228,auVar29);
  auVar151 = vmulsd_avx512f(auVar228,auVar151);
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       auVar146._0_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar146 = vsubsd_avx512f(auVar166,auVar149);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar149 = vmulsd_avx512f(auVar240,auVar30);
  auVar146 = vsubsd_avx512f(auVar146,auVar149);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar149 = vmulsd_avx512f(auVar476,auVar31);
  auVar146 = vmulsd_avx512f(auVar590,auVar146);
  auVar151 = vaddsd_avx512f(auVar151,auVar146);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar146 = vmulsd_avx512f(auVar476,auVar32);
  auVar154 = vxorpd_avx512vl(auVar543,auVar159);
  dVar172 = auVar154._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar153 = vmulsd_avx512f(auVar476,auVar33);
  auVar176._8_8_ = 0;
  auVar176._0_8_ =
       dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar146 = vsubsd_avx512f(auVar176,auVar146);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar156 = vmulsd_avx512f(auVar385,auVar34);
  auVar146 = vsubsd_avx512f(auVar146,auVar156);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar156 = vmulsd_avx512f(auVar154,auVar35);
  auVar146 = vmulsd_avx512f(auVar593,auVar146);
  auVar149 = vsubsd_avx512f(auVar156,auVar149);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar156 = vmulsd_avx512f(auVar385,auVar36);
  auVar149 = vsubsd_avx512f(auVar149,auVar156);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar154 = vmulsd_avx512f(auVar154,auVar37);
  auVar149 = vmulsd_avx512f(auVar600,auVar149);
  auVar154 = vsubsd_avx512f(auVar154,auVar153);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar153 = vmulsd_avx512f(auVar385,auVar38);
  auVar154 = vsubsd_avx512f(auVar154,auVar153);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar153 = vmulsd_avx512f(auVar543,auVar39);
  auVar154 = vmulsd_avx512f(auVar597,auVar154);
  auVar149 = vaddsd_avx512f(auVar149,auVar154);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar154 = vmulsd_avx512f(auVar543,auVar40);
  auVar146 = vaddsd_avx512f(auVar146,auVar149);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar149 = vmulsd_avx512f(auVar543,auVar41);
  auVar177._8_8_ = 0;
  auVar177._0_8_ =
       dStack_508 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar149 = vaddsd_avx512f(auVar177,auVar149);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar156 = vmulsd_avx512f(auVar385,auVar42);
  auVar149 = vaddsd_avx512f(auVar156,auVar149);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar156 = vmulsd_avx512f(auVar476,auVar43);
  auVar154 = vaddsd_avx512f(auVar156,auVar154);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar156 = vmulsd_avx512f(auVar385,auVar44);
  auVar154 = vaddsd_avx512f(auVar156,auVar154);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar156 = vmulsd_avx512f(auVar476,auVar45);
  auVar154 = vmulsd_avx512f(auVar228,auVar154);
  auVar153 = vaddsd_avx512f(auVar156,auVar153);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar156 = vmulsd_avx512f(auVar385,auVar46);
  auVar153 = vaddsd_avx512f(auVar156,auVar153);
  auVar153 = vmulsd_avx512f(auVar590,auVar153);
  auVar154 = vaddsd_avx512f(auVar154,auVar153);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = dStack_518 * auVar149._0_8_;
  auVar149 = vaddsd_avx512f(auVar178,auVar154);
  auVar154 = vmulsd_avx512f(ZEXT816(0x4000000000000000),auVar559);
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [4] = auVar152._0_8_ + auVar147._0_8_ + dStack_518 * auVar141._0_8_ + auVar151._0_8_ +
        auVar146._0_8_ + auVar149._0_8_;
  auVar141 = vmulsd_avx512f(ZEXT816(0x4000000000000000),auVar585);
  auVar586._8_8_ = 0;
  auVar586._0_8_ = local_438;
  auVar151 = vmulsd_avx512f(auVar586,auVar583);
  auVar152 = vmulsd_avx512f(auVar586,auVar549);
  auVar587._8_8_ = 0;
  auVar587._0_8_ = local_438;
  auVar146 = vmulsd_avx512f(auVar587,auVar571);
  auVar147 = vmulsd_avx512f(auVar139,auVar580);
  auVar149 = vmulsd_avx512f(ZEXT816(0x4000000000000000),auVar575);
  auVar321._8_8_ = 0;
  auVar321._0_8_ = auVar154._0_8_ + auVar152._0_8_ + auVar155._0_8_;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = dStack_4f8;
  auVar152 = vmulsd_avx512f(auVar321,auVar598);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = auVar147._0_8_ + auVar141._0_8_ + auVar151._0_8_;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = local_528;
  auVar141 = vmulsd_avx512f(auVar167,auVar594);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = auVar148._0_8_ + auVar146._0_8_ + auVar149._0_8_;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = dStack_510;
  auVar151 = vmulsd_avx512f(auVar179,auVar601);
  dVar171 = auVar141._0_8_ + auVar151._0_8_ + auVar152._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar171;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = local_4e8;
  auVar141 = vmulsd_avx512f(auVar591,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar151 = vmulsd_avx512f(auVar591,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar152 = vmulsd_avx512f(auVar591,auVar49);
  auVar180._8_8_ = 0;
  auVar180._0_8_ =
       dStack_518 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + dStack_500 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] + auVar141._0_8_;
  auVar141 = vmulsd_avx512f(auVar138,auVar180);
  auVar322._8_8_ = 0;
  auVar322._0_8_ =
       dStack_518 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       + auVar151._0_8_ +
         dStack_500 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4];
  auVar151 = vmulsd_avx512f(auVar140,auVar322);
  auVar550._8_8_ = 0;
  auVar550._0_8_ =
       dStack_518 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + dStack_500 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] + auVar152._0_8_;
  auVar152 = vmulsd_avx512f(auVar139,auVar550);
  dVar171 = dVar171 + auVar141._0_8_ + auVar152._0_8_ + auVar151._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar171;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar141 = vmulsd_avx512f(auVar144,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar151 = vmulsd_avx512f(auVar145,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar152 = vmulsd_avx512f(auVar145,auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar145 = vmulsd_avx512f(auVar145,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar146 = vmulsd_avx512f(auVar142,auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar147 = vmulsd_avx512f(auVar144,auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar148 = vmulsd_avx512f(auVar142,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar149 = vmulsd_avx512f(auVar144,auVar57);
  auVar144._8_8_ = 0;
  auVar144._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar154 = vmulsd_avx512f(auVar142,auVar144);
  auVar551._8_8_ = 0;
  auVar551._0_8_ = auVar154._0_8_ + auVar149._0_8_ + auVar145._0_8_;
  auVar145 = vmulsd_avx512f(auVar591,auVar551);
  dVar171 = dVar171 + dStack_518 * (auVar146._0_8_ + auVar141._0_8_ + auVar151._0_8_) +
                      auVar145._0_8_ +
                      dStack_500 * (auVar148._0_8_ + auVar152._0_8_ + auVar147._0_8_);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar171;
  auVar142._8_8_ = 0;
  auVar142._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar141 = vmulsd_avx512f(auVar609,auVar142);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar151 = vmulsd_avx512f(auVar609,auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar152 = vmulsd_avx512f(auVar140,auVar59);
  auVar323._8_8_ = 0;
  auVar323._0_8_ =
       ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [2] * 2.0 - auVar141._0_8_) - auVar152._0_8_;
  auVar141 = vmulsd_avx512f(auVar594,auVar323);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar152 = vmulsd_avx512f(auVar140,auVar60);
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar145 = vmulsd_avx512f(auVar609,auVar61);
  auVar552._8_8_ = 0;
  auVar552._0_8_ =
       ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [5] * 2.0 - auVar151._0_8_) - auVar152._0_8_;
  auVar151 = vmulsd_avx512f(auVar601,auVar552);
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar152 = vmulsd_avx512f(auVar140,auVar62);
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [8] * 2.0 - auVar145._0_8_) - auVar152._0_8_;
  auVar152 = vmulsd_avx512f(auVar598,auVar181);
  dVar171 = dVar171 + auVar141._0_8_ + auVar151._0_8_ + auVar152._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar171;
  auVar182._8_8_ = 0;
  auVar182._0_8_ =
       (dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] -
       dStack_508 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       ) - dStack_520 *
           (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
  auVar141 = vmulsd_avx512f(auVar138,auVar182);
  auVar324._8_8_ = 0;
  auVar324._0_8_ =
       (dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] -
       dStack_508 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       ) - dStack_520 *
           (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar151 = vmulsd_avx512f(auVar140,auVar324);
  auVar553._8_8_ = 0;
  auVar553._0_8_ =
       (dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8] -
       dStack_508 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       ) - dStack_520 *
           (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6];
  auVar152 = vmulsd_avx512f(auVar139,auVar553);
  dVar171 = dVar171 + auVar141._0_8_ + auVar152._0_8_ + auVar151._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar171;
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar610._8_8_ = 0;
  auVar610._0_8_ = dStack_318;
  auVar141 = vmulsd_avx512f(auVar610,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar151 = vmulsd_avx512f(auVar140,auVar64);
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar152 = vmulsd_avx512f(auVar610,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar145 = vmulsd_avx512f(auVar140,auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar146 = vmulsd_avx512f(auVar610,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar147 = vmulsd_avx512f(auVar140,auVar68);
  auVar554._8_8_ = 0;
  auVar554._0_8_ =
       auVar147._0_8_ +
       auVar146._0_8_ +
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       * -2.0;
  auVar146 = vmulsd_avx512f(auVar591,auVar554);
  dVar171 = dVar171 + dStack_518 *
                      (auVar151._0_8_ +
                      auVar141._0_8_ +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * -2.0) +
                      auVar146._0_8_ +
                      dStack_500 *
                      (auVar145._0_8_ +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] * -2.0 + auVar152._0_8_);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar171;
  auVar183._8_8_ = 0;
  auVar183._0_8_ =
       dStack_520 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       + dStack_508 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] + dStack_4f0 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar141 = vmulsd_avx512f(auVar139,auVar183);
  auVar325._8_8_ = 0;
  auVar325._0_8_ =
       dStack_520 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       + dStack_4f0 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [5] + dStack_508 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4];
  auVar151 = vmulsd_avx512f(ZEXT816(0x4000000000000000),auVar325);
  auVar555._8_8_ = 0;
  auVar555._0_8_ =
       dStack_520 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + dStack_508 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] + dStack_4f0 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8];
  auVar152 = vmulsd_avx512f(auVar587,auVar555);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar171 + auVar141._0_8_ + auVar152._0_8_ + auVar151._0_8_;
  dVar171 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar168._8_8_ = 0;
  auVar168._0_8_ =
       (local_420 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1] + dStack_348 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) - (dVar171 + dVar171);
  auVar141 = vmulsd_avx512f(auVar594,auVar168);
  dVar171 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  auVar184._8_8_ = 0;
  auVar184._0_8_ =
       (local_420 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] + dStack_348 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) - (dVar171 + dVar171);
  auVar151 = vmulsd_avx512f(auVar601,auVar184);
  dVar171 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  auVar326._8_8_ = 0;
  auVar326._0_8_ =
       (dStack_348 *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [8] + local_420 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) - (dVar171 + dVar171);
  auVar152 = vmulsd_avx512f(auVar598,auVar326);
  dVar384 = auVar141._0_8_ + auVar151._0_8_ + auVar152._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar384;
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar141 = vmulsd_avx512f(auVar591,auVar140);
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar151 = vmulsd_avx512f(auVar591,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar152 = vmulsd_avx512f(auVar591,auVar70);
  auVar327._8_8_ = 0;
  auVar327._0_8_ =
       dStack_518 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       + auVar151._0_8_ +
         dStack_500 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4];
  auVar151 = vmulsd_avx512f(auVar138,auVar327);
  dVar171 = dStack_518 *
            (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6] +
            dStack_500 *
            (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] + auVar152._0_8_;
  auVar152 = vshufpd_avx512vl(auVar139,auVar139,1);
  dVar384 = dVar384 + dVar171 + dVar171 + auVar151._0_8_ +
                      auVar152._0_8_ *
                      (dStack_518 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      dStack_500 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] + auVar141._0_8_);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar384;
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar141 = vmulsd_avx512f(ZEXT816(0x4010000000000000),auVar139);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar151 = vmulsd_avx512f(ZEXT816(0x4010000000000000),auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar145 = vmulsd_avx512f(ZEXT816(0x4010000000000000),auVar72);
  auVar560._8_8_ = 0;
  auVar560._0_8_ =
       auVar145._0_8_ +
       local_410 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       + local_418 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8];
  auVar145 = vmulsd_avx512f(auVar591,auVar560);
  dVar384 = dVar384 + (auVar151._0_8_ +
                      local_410 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
                      local_418 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * dStack_500 + auVar145._0_8_ +
                      dStack_518 *
                      (auVar141._0_8_ +
                      local_418 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      local_410 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]);
  dVar171 = -dStack_350;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar384;
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar141 = vmulsd_avx512f(auVar604,auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar151 = vmulsd_avx512f(auVar604,auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar145 = vmulsd_avx512f(auVar138,auVar75);
  auVar556._8_8_ = 0;
  auVar556._0_8_ =
       (dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] - auVar141._0_8_) - auVar145._0_8_;
  auVar141 = vmulsd_avx512f(auVar594,auVar556);
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar145 = vmulsd_avx512f(auVar138,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar146 = vmulsd_avx512f(auVar604,auVar77);
  auVar561._8_8_ = 0;
  auVar561._0_8_ =
       (dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] - auVar151._0_8_) - auVar145._0_8_;
  auVar151 = vmulsd_avx512f(auVar601,auVar561);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar145 = vmulsd_avx512f(auVar138,auVar78);
  auVar185._8_8_ = 0;
  auVar185._0_8_ =
       (dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8] - auVar146._0_8_) - auVar145._0_8_;
  auVar145 = vmulsd_avx512f(auVar598,auVar185);
  dVar384 = dVar384 + auVar141._0_8_ + auVar151._0_8_ + auVar145._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar384;
  auVar557._8_8_ = 0;
  auVar557._0_8_ =
       (dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] -
       dStack_508 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       ) - dStack_520 *
           (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar141 = vmulsd_avx512f(auVar138,auVar557);
  dVar171 = (dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8] -
            dStack_508 *
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7]) -
            dStack_520 *
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  dVar384 = dVar384 + auVar152._0_8_ *
                      ((dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dStack_508 *
                       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      dStack_520 *
                      (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) + auVar141._0_8_ + dVar171 + dVar171;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar384;
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = dStack_330;
  auVar141 = vmulsd_avx512f(auVar605,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar151 = vmulsd_avx512f(auVar138,auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar152 = vmulsd_avx512f(auVar605,auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar145 = vmulsd_avx512f(auVar138,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar146 = vmulsd_avx512f(auVar605,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar147 = vmulsd_avx512f(auVar138,auVar84);
  auVar328._8_8_ = 0;
  auVar328._0_8_ =
       auVar147._0_8_ +
       dStack_350 *
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       + auVar146._0_8_;
  auVar146 = vmulsd_avx512f(auVar591,auVar328);
  dVar384 = dVar384 + dStack_518 *
                      (auVar151._0_8_ +
                      auVar141._0_8_ +
                      dStack_350 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) +
                      dStack_500 *
                      (auVar145._0_8_ +
                      auVar152._0_8_ +
                      dStack_350 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) + auVar146._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar384;
  dVar171 = dStack_520 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0] +
            dStack_508 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] +
            dStack_4f0 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar384 + ((local_420 *
                   (dStack_520 *
                    (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[3] +
                   dStack_508 *
                   (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] +
                   dStack_4f0 *
                   (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5]) +
                  dStack_348 *
                  (dStack_520 *
                   (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6] +
                  dStack_508 *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[7] +
                  dStack_4f0 *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8])) - (dVar171 + dVar171));
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar141 = vmulsd_avx512f(auVar138,auVar85);
  auVar161._8_8_ = 0;
  auVar161._0_8_ =
       auVar141._0_8_ +
       dStack_3b0 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       + dStack_398 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [2];
  auVar595._8_8_ = 0;
  auVar595._0_8_ = local_528;
  auVar141 = vmulsd_avx512f(auVar595,auVar161);
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar151 = vmulsd_avx512f(auVar138,auVar86);
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       auVar151._0_8_ +
       dStack_3b0 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       + dStack_398 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [5];
  auVar602._8_8_ = 0;
  auVar602._0_8_ = dStack_510;
  auVar151 = vmulsd_avx512f(auVar602,auVar169);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar152 = vmulsd_avx512f(auVar138,auVar87);
  auVar186._8_8_ = 0;
  auVar186._0_8_ =
       auVar152._0_8_ +
       dStack_3b0 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       + dStack_398 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8];
  auVar599._8_8_ = 0;
  auVar599._0_8_ = dStack_4f8;
  auVar152 = vmulsd_avx512f(auVar599,auVar186);
  dVar173 = auVar141._0_8_ + auVar151._0_8_ + auVar152._0_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar173;
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar141 = vmulsd_avx512f(auVar591,auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar151 = vmulsd_avx512f(auVar591,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar152 = vmulsd_avx512f(auVar591,auVar90);
  dVar171 = dStack_518 *
            (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3] +
            dStack_500 *
            (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4] + auVar151._0_8_;
  auVar329._8_8_ = 0;
  auVar329._0_8_ =
       dStack_518 *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + dStack_500 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] + auVar152._0_8_;
  auVar151 = vmulsd_avx512f(auVar138,auVar329);
  dVar173 = dVar173 + (dStack_518 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      dStack_500 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] + auVar141._0_8_) * (double)local_558 +
                      (auVar151._0_8_ - (dVar171 + dVar171));
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar173;
  auVar330._8_8_ = 0;
  auVar330._0_8_ =
       local_3f0 *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + local_3e0 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7] + local_3e8 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8];
  auVar141 = vmulsd_avx512f(auVar591,auVar330);
  dVar173 = dVar173 + dStack_518 *
                      (local_3f0 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      local_3e0 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
                      local_3e8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) +
                      dStack_500 *
                      (local_3f0 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
                      local_3e0 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
                      local_3e8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) + auVar141._0_8_;
  dVar163 = -dStack_3a0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar173;
  dVar171 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3];
  dVar384 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  dVar172 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6];
  dVar173 = dVar173 + ((dVar163 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       (double)local_558 *
                       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) - (dVar384 + dVar384)) * local_528 +
                      ((dVar163 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       (double)local_558 *
                       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4]) - (dVar171 + dVar171)) * dStack_510 +
                      ((dVar163 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       (double)local_558 *
                       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7]) - (dVar172 + dVar172)) * dStack_4f8;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar173;
  dVar171 = -dStack_4f0;
  dVar173 = dVar173 + ((dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dStack_508 *
                       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      dStack_520 *
                      (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * (double)local_558 +
                      ((dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       dStack_508 *
                       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4]) -
                      dStack_520 *
                      (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * -2.0 +
                      ((dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       dStack_508 *
                       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7]) -
                      dStack_520 *
                      (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6]) * dStack_3a8;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar173;
  dVar173 = dVar173 + ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] * 2.0 +
                      dStack_3a0 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      (double)local_558 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * dStack_518 +
                      ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] * 2.0 +
                      dStack_3a0 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] +
                      (double)local_558 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7]) * local_4e8 +
                      ((double)local_558 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       dStack_3a0 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3] * 2.0) * dStack_500;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar173;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar173 + (dStack_520 *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 dStack_4f0 *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] +
                 dStack_508 *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) * dStack_3c8 +
                 (dStack_508 *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] +
                  dStack_4f0 *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] +
                 dStack_520 *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3]) * dStack_3b0 +
                 (dStack_520 *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dStack_508 *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
                 dStack_4f0 *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) * dStack_398;
  dVar384 = -local_4e8;
  dVar171 = -dStack_4f0;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [8] = (dStack_518 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + dStack_500 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_4e8 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) * dStack_520 +
        (dStack_518 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + dStack_500 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_4e8 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) * dStack_508 +
        dStack_4f0 *
        (dStack_518 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + dStack_500 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               local_4e8 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) +
        ((dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[2] -
         dStack_500 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[1]) -
        dStack_518 *
        (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
        array[0]) * local_528 +
        ((dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[5] -
         dStack_500 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[4]) -
        dStack_518 *
        (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
        array[3]) * dStack_510 +
        dStack_4f8 *
        ((dVar384 * (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[8] -
         dStack_500 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[7]) -
        dStack_518 *
        (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
        array[6]) +
        dStack_520 *
        ((dVar171 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2] -
         dStack_508 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) - dStack_520 *
                (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0]) +
        dStack_508 *
        ((dVar171 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5] -
         dStack_508 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4]) - dStack_520 *
                (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3]) +
        dStack_4f0 *
        ((dVar171 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8] -
         dStack_508 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7]) - dStack_520 *
                (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6]) +
        (dStack_520 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + dStack_508 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               dStack_4f0 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) * local_528 +
        (dStack_520 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + dStack_4f0 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5] +
               dStack_508 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4]) * dStack_510 +
        dStack_4f8 *
        (dStack_520 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + dStack_508 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               dStack_4f0 *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]);
  dVar384 = -dStack_318;
  dVar171 = (dStack_350 *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[0] +
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] * 2.0 +
            dStack_318 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2]) * dStack_520 +
            (dStack_350 *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] +
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4] * 2.0 +
            dStack_318 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5]) * dStack_508 +
            (dStack_350 *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] +
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] * 2.0 +
            dStack_318 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8]) * dStack_4f0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + dStack_330 *
                      (dStack_518 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      local_4e8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      dStack_500 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) +
                      (dStack_518 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      dStack_500 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      local_4e8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * -2.0 +
                      dStack_318 *
                      (dStack_500 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       local_4e8 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      dStack_518 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar172 = -local_4e8;
  dVar171 = dVar171 + ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[2] -
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[1] * 2.0) -
                      dStack_350 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[0]) * local_528 +
                      ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5] -
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[4] * 2.0) -
                      dStack_350 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[3]) * dStack_510 +
                      ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[8] -
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[7] * 2.0) -
                      dStack_350 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[6]) * dStack_4f8;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar384 = dStack_318 * -2.0;
  dVar171 = dVar171 + ((dVar172 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[2] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[1]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[0]) * local_338 +
                      ((dVar172 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[4]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[3]) * dStack_330 +
                      ((dVar172 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[8] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[7]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[6]) * dStack_308;
  dVar172 = dStack_330 * -2.0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + (dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * 4.0) * dStack_520 +
                      (dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] * 4.0) * dStack_508 +
                      (dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] * 4.0) * dStack_4f0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + (dStack_330 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * -2.0 +
                      dStack_318 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * local_528 +
                      (dStack_318 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] * -2.0 +
                      dStack_330 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_510 +
                      (dStack_330 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] * -2.0 +
                      dStack_318 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7]) * dStack_4f8;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171 + (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2]) * local_338 +
                 (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[3] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5]) * dStack_330 +
                 (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) * dStack_308;
  dVar384 = -dStack_348;
  dVar171 = ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[0] * -2.0 +
            local_420 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] +
            dStack_348 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2]) * dStack_520 +
            ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] * -2.0 +
            local_420 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4] +
            dStack_348 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5]) * dStack_508 +
            ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] * -2.0 +
            local_420 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] +
            dStack_348 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8]) * dStack_4f0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + dStack_380 *
                      (dStack_518 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      local_4e8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      dStack_500 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) +
                      (dStack_518 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      dStack_500 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      local_4e8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * dStack_350 +
                      dStack_330 *
                      (dStack_500 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       local_4e8 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      dStack_518 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar173 = -local_4e8;
  dVar171 = dVar171 + ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[2] -
                       local_420 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[1]) -
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[0] * -2.0) * local_528 +
                      ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5] -
                       local_420 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[4]) -
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[3] * -2.0) * dStack_510 +
                      ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[8] -
                       local_420 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[7]) -
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[6] * -2.0) * dStack_4f8;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar384 = dStack_350 * -2.0;
  dVar172 = dStack_330 * -2.0;
  dVar171 = dVar171 + ((dVar173 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[2] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[1]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[0]) * local_388 +
                      ((dVar173 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[4]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[3]) * local_338 +
                      ((dVar173 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[8] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[7]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[6]) * 2.0;
  dVar173 = dStack_380 * -2.0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2]) * dStack_520 +
                      (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * dStack_508 +
                      (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * dStack_4f0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + (dStack_380 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      dStack_350 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      dStack_330 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * local_528 +
                      (dStack_330 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       dStack_350 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      dStack_380 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_510 +
                      (dStack_380 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      dStack_350 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] +
                      dStack_330 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7]) * dStack_4f8;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171 + (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2]) * local_388 +
                 (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[3] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5]) * local_338 +
                 (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) * 2.0;
  dVar384 = -dStack_398;
  dVar171 = (dStack_3c8 *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[0] +
            dStack_3b0 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] +
            dStack_398 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2]) * dStack_520 +
            (dStack_3c8 *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] +
            dStack_3b0 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4] +
            dStack_398 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5]) * dStack_508 +
            (dStack_3c8 *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] +
            dStack_3b0 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] +
            dStack_398 *
            (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8]) * dStack_4f0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + (dStack_518 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      local_4e8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      dStack_500 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * 2.0 +
                      (dStack_518 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      dStack_500 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      local_4e8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * dStack_3a0 +
                      (double)local_558 *
                      (dStack_500 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       local_4e8 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      dStack_518 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar173 = -local_4e8;
  dVar171 = dVar171 + ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[2] -
                       dStack_3b0 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[1]) -
                      dStack_3c8 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[0]) * local_528 +
                      ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5] -
                       dStack_3b0 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[4]) -
                      dStack_3c8 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[3]) * dStack_510 +
                      ((dVar384 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[8] -
                       dStack_3b0 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[7]) -
                      dStack_3c8 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[6]) * dStack_4f8;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar384 = dStack_3a0 * -2.0;
  dVar172 = (double)local_558 * -2.0;
  dVar171 = dVar171 + ((dVar173 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[2] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[1]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[0]) * (double)local_558 +
                      ((dVar173 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[5] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[4]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[3]) * -2.0 +
                      ((dVar173 * (local_440->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array[8] -
                       dStack_500 *
                       (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[7]) -
                      dStack_518 *
                      (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[6]) * dStack_3a8;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] * -4.0 +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2]) * dStack_520 +
                      ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] * -4.0 +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * dStack_508 +
                      ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] * -4.0 +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * dStack_4f0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  dVar171 = dVar171 + ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] * 2.0 +
                      dStack_3a0 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      (double)local_558 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * local_528 +
                      dStack_510 *
                      ((double)local_558 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       dStack_3a0 *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3] * 2.0) +
                      dStack_4f8 *
                      ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] * 2.0 +
                      dStack_3a0 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] +
                      (double)local_558 *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       dVar171 + (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2]) * (double)local_558 +
                 (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[3] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4]) * -2.0 +
                 (dStack_520 *
                  (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dStack_508 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
                 dStack_4f0 *
                 (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) * dStack_3a8;
  dVar384 = dStack_4f8 * -2.0;
  dVar172 = dStack_510 * -2.0;
  dVar173 = local_528 * -2.0;
  dVar171 = dStack_308 + dStack_308;
  dVar163 = dStack_308 * -2.0;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [5] = local_528 *
        (local_528 *
         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + dStack_510 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               dStack_4f8 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) +
        dStack_510 *
        (local_528 *
         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + dStack_510 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               dStack_4f8 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) +
        dStack_4f8 *
        (local_528 *
         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + dStack_510 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               dStack_4f8 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) +
        (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[0] +
        dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[1] +
        dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) * dStack_518 +
        (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[3] +
        dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] +
        dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5]) * dStack_500 +
        (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6] +
        dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[7] +
        dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8]) * local_4e8 +
        dStack_518 *
        (dStack_518 *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + dStack_500 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_4e8 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) +
        dStack_500 *
        (dStack_518 *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + dStack_500 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_4e8 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) +
        local_4e8 *
        (dStack_518 *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + local_4e8 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8] +
               dStack_500 *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7]);
  dVar384 = dStack_330 + dStack_330;
  dVar173 = dStack_330 * -2.0;
  dVar172 = local_338 + local_338;
  dVar91 = local_338 * -2.0;
  dVar171 = (dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
            dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
            dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * local_528 +
            (dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
             dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
            dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_510 +
            dStack_4f8 *
            (dVar172 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
            dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
            dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  dVar171 = dVar171 + (dVar91 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0] +
                      dVar163 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1]) * dStack_518 +
                      (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[4] +
                       dVar163 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[5] +
                      dVar91 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[3]) * dStack_500 +
                      local_4e8 *
                      (dVar91 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar163 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]);
  dVar384 = local_528 * -2.0;
  dVar172 = dStack_510 * -2.0;
  dVar173 = dStack_4f8 * -2.0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  dVar171 = dVar171 + (dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1]) * dStack_350 +
                      (dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[4] +
                       dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[5] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3]) * 2.0 +
                      dStack_318 *
                      (dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]);
  dVar384 = dStack_350 + dStack_350;
  dVar172 = dStack_318 + dStack_318;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171 + (dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[0] +
                 dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2] +
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] * 4.0) * dStack_518 +
                 ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] * 4.0 +
                  dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[5] +
                 dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[3]) * dStack_500 +
                 local_4e8 *
                 (dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[6] +
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] * 4.0 +
                 dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8]);
  dVar171 = local_338 + local_338;
  dVar384 = local_388 + local_388;
  dVar172 = local_338 * -2.0;
  dVar173 = local_388 * -2.0;
  dVar171 = (dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2] * 4.0 +
            dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * local_528 +
            (dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5] * 4.0 +
            dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_510 +
            dStack_4f8 *
            (dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
            dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8] * 4.0);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  dVar171 = dVar171 + (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * -4.0 +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1]) * dStack_518 +
                      (dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[4] +
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] * -4.0 +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3]) * dStack_500 +
                      local_4e8 *
                      (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] * -4.0);
  dVar384 = local_528 * -2.0;
  dVar172 = dStack_510 * -2.0;
  dVar173 = dStack_4f8 * -2.0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  dVar171 = dVar171 + (dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1]) * -2.0 +
                      (dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[4] +
                       dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[5] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3]) * local_420 +
                      dStack_348 *
                      (dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]);
  dVar384 = local_420 + local_420;
  dVar172 = dStack_348 + dStack_348;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171 + ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] * -4.0 +
                 dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2] +
                 dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[1]) * dStack_518 +
                 (dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[4] +
                  dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[5] +
                 (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] * -4.0) * dStack_500 +
                 local_4e8 *
                 ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] * -4.0 +
                 dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[7] +
                 dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8]);
  dVar171 = dStack_3a8 + dStack_3a8;
  dVar384 = (double)local_558 + (double)local_558;
  dVar172 = dStack_3a8 * -2.0;
  dVar173 = (double)local_558 * -2.0;
  dVar171 = (dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
            dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] * -4.0) * local_528 +
            ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] * -4.0 +
             dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
            dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_510 +
            dStack_4f8 *
            (dVar384 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
            (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] * -4.0 +
            dVar171 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  dVar171 = dVar171 + (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] * 4.0) * dStack_518 +
                      ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] * 4.0 +
                       dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[5] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3]) * dStack_500 +
                      local_4e8 *
                      (dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] * 4.0 +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]);
  dVar384 = local_528 * -2.0;
  dVar172 = dStack_510 * -2.0;
  dVar173 = dStack_4f8 * -2.0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  dVar171 = dVar171 + (dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1]) * dStack_3c8 +
                      (dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[4] +
                       dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[5] +
                      dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3]) * dStack_3b0 +
                      dStack_398 *
                      (dVar384 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar172 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar173 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]);
  dVar384 = dStack_3c8 + dStack_3c8;
  dVar172 = dStack_3b0 + dStack_3b0;
  dVar173 = dStack_398 + dStack_398;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       dVar171 + (dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[0] +
                 dVar173 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2] +
                 dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[1]) * dStack_518 +
                 (dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[4] +
                  dVar173 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[5] +
                 dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[3]) * dStack_500 +
                 local_4e8 *
                 (dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[6] +
                 dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[7] +
                 dVar173 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8]);
  dVar171 = -dStack_4f8;
  dVar384 = -local_4e8;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [9] = (local_528 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + dStack_510 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               dStack_4f8 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) * dStack_520 +
        (local_528 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + dStack_510 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               dStack_4f8 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) * dStack_508 +
        dStack_4f0 *
        (local_528 *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + dStack_4f8 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8] +
               dStack_510 *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7]) +
        local_528 *
        ((dVar171 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2] -
         dStack_510 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) - local_528 *
                (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0]) +
        ((dVar171 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5] -
         dStack_510 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4]) - local_528 *
                (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3]) * dStack_510 +
        dStack_4f8 *
        ((dVar171 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8] -
         dStack_510 *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7]) - local_528 *
                (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6]) +
        ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2] -
         dStack_500 *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) - dStack_518 *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0]) * dStack_520 +
        ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8] -
         dStack_500 *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7]) - dStack_518 *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6]) * dStack_4f0 +
        ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5] -
         dStack_500 *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4]) - dStack_518 *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3]) * dStack_508 +
        (dStack_518 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + local_4e8 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2] +
               dStack_500 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1]) * local_528 +
        (dStack_500 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4] + local_4e8 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5] +
        dStack_518 *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3]) * dStack_510 +
        (dStack_518 *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + local_4e8 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8] +
               dStack_500 *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7]) * dStack_4f8;
  dVar171 = (local_338 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[0] +
            dStack_308 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2] +
            dStack_330 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1]) * dStack_520 +
            (local_338 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] +
            dStack_330 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[7] +
            dStack_308 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8]) * dStack_4f0 +
            (dStack_330 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             dStack_308 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5] +
            local_338 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3]) * dStack_508;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = local_338 * -2.0;
  dVar172 = dStack_330 * -2.0;
  dVar171 = dVar171 + (dStack_510 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1] +
                       dStack_4f8 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] +
                      local_528 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * dStack_330 +
                      (local_528 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
                      dStack_510 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
                      dStack_4f8 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * dStack_318 +
                      (local_528 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      dStack_510 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      dStack_4f8 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * -2.0;
  dVar173 = dStack_308 * -2.0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar171 = dVar171 + (dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1] +
                      dVar173 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2]) * local_528 +
                      (dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar173 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * dStack_510 +
                      (dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      dVar173 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * dStack_4f8;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = -dStack_318;
  dVar171 = dVar171 + ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1] * 2.0) -
                      dStack_350 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * dStack_520 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] * 2.0) -
                      dStack_350 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_508 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] * 2.0) -
                      dStack_350 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6]) * dStack_4f0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = -local_4e8;
  dVar171 = dVar171 + ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * dStack_330 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_318 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6]) * -2.0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar171 = dVar171 + ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1] * 2.0 +
                       dStack_318 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] +
                      dStack_350 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * local_528 +
                      ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] * 2.0 +
                       dStack_318 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      dStack_350 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_510 +
                      dStack_4f8 *
                      (dStack_350 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] * 2.0 +
                      dStack_318 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171 + (dStack_518 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 local_4e8 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] +
                 dStack_500 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) * local_338 +
                 (dStack_500 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] +
                  local_4e8 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] +
                 dStack_518 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3]) * dStack_330 +
                 (dStack_518 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dStack_500 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
                 local_4e8 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) * dStack_308;
  dVar384 = local_338 * -2.0;
  dVar171 = (local_388 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[0] +
            local_338 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] +
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2] * 2.0) * dStack_520 +
            (local_388 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] +
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5] * 2.0 +
            local_338 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4]) * dStack_508 +
            (local_338 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8] * 2.0 +
            local_388 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6]) * dStack_4f0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar172 = local_388 * -2.0;
  dVar171 = dVar171 + (local_528 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      dStack_4f8 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      dStack_510 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * dStack_380 +
                      (dStack_510 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       dStack_4f8 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      local_528 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_330 +
                      (local_528 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      dStack_4f8 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] +
                      dStack_510 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7]) * dStack_350;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar171 = dVar171 + (dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[1] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] * -4.0) * local_528 +
                      (dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] * -4.0) * dStack_510 +
                      (dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] * -4.0) * dStack_4f8;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = -dStack_348;
  dVar171 = dVar171 + ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       local_420 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0] * -2.0) * dStack_520 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       local_420 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4]) -
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3] * -2.0) * dStack_508 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       local_420 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7]) -
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6] * -2.0) * dStack_4f0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = -local_4e8;
  dVar171 = dVar171 + ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * dStack_380 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_330 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6]) * dStack_350;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar171 = dVar171 + (local_420 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1] +
                       dStack_348 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] +
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0] * -2.0) * local_528 +
                      (local_420 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       dStack_348 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3] * -2.0) * dStack_510 +
                      dStack_4f8 *
                      ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] * -2.0 +
                      local_420 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      dStack_348 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171 + (dStack_518 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 local_4e8 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] +
                 dStack_500 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) * local_388 +
                 (dStack_500 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] +
                  local_4e8 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] +
                 dStack_518 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3]) * local_338 +
                 (dStack_518 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dStack_500 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
                 local_4e8 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) * 2.0;
  dVar171 = ((double)local_558 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[0] +
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1] * -2.0 +
            dStack_3a8 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2]) * dStack_520 +
            ((double)local_558 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] +
            dStack_3a8 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5] +
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[4] * -2.0) * dStack_508 +
            ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] * -2.0 +
             dStack_3a8 *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8] +
            (double)local_558 *
            (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6]) * dStack_4f0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = dStack_3a8 * -2.0;
  dVar172 = (double)local_558 * -2.0;
  dVar171 = dVar171 + (local_528 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      dStack_4f8 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2] +
                      dStack_510 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1]) * 2.0 +
                      (dStack_510 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
                       dStack_4f8 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5] +
                      local_528 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * (double)local_558 +
                      (local_528 *
                       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      dStack_4f8 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] +
                      dStack_510 *
                      (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7]) * dStack_3a0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar171 = dVar171 + (dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] * 4.0 +
                      dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2]) * local_528 +
                      (dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] * 4.0 +
                      dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * dStack_510 +
                      (dVar172 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] * 4.0 +
                      dVar384 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8]) * dStack_4f8;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = -dStack_398;
  dVar171 = dVar171 + ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dStack_3b0 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      dStack_3c8 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * dStack_520 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       dStack_3b0 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4]) -
                      dStack_3c8 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * dStack_508 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       dStack_3b0 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7]) -
                      dStack_3c8 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6]) * dStack_4f0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = -local_4e8;
  dVar171 = dVar171 + ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * 2.0 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[5] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3]) * (double)local_558 +
                      ((dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[8] -
                       dStack_500 *
                       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7]) -
                      dStack_518 *
                      (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[6]) * dStack_3a0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  dVar384 = dStack_510 * -2.0;
  dVar172 = dStack_4f8 * -2.0;
  dVar173 = local_528 * -2.0;
  dVar171 = dVar171 + (dStack_3b0 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1] +
                       dStack_398 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] +
                      dStack_3c8 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * local_528 +
                      (dStack_3c8 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
                      dStack_3b0 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
                      dStack_398 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * dStack_510 +
                      dStack_4f8 *
                      (dStack_3c8 *
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      dStack_3b0 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      dStack_398 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       dVar171 + (dStack_518 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 local_4e8 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] +
                 dStack_500 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1]) * (double)local_558 +
                 (dStack_500 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] +
                  local_4e8 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5] +
                 dStack_518 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3]) * -2.0 +
                 (dStack_518 *
                  (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dStack_500 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
                 local_4e8 *
                 (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) * dStack_3a8;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [10] = dStack_520 *
         (dStack_520 *
          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0] + dStack_4f0 *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[2] +
                dStack_508 *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[1]) +
         (dStack_520 *
          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6] + dStack_508 *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7] +
                dStack_4f0 *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[8]) * dStack_4f0 +
         dStack_508 *
         (dStack_508 *
          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4] + dStack_4f0 *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[5] +
         dStack_520 *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3]) + (dVar384 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[1] +
                 dVar172 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[2] +
                dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[0]) * dStack_520 +
                (dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[3] +
                dVar384 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[4] +
                dVar172 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[5]) * dStack_508 +
                (dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[6] +
                dVar172 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[8] +
                dVar384 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[7]) * dStack_4f0 +
         local_528 *
         (local_528 *
          (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
          .array[0] +
         dStack_510 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[1] +
         dStack_4f8 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[2]) +
         dStack_510 *
         (local_528 *
          (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
          .array[3] +
         dStack_510 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[4] +
         dStack_4f8 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[5]) +
         dStack_4f8 *
         (local_528 *
          (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
          .array[6] +
         dStack_4f8 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[8] +
         dStack_510 *
         (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[7]);
  dVar171 = dStack_318 + dStack_318;
  dVar384 = dStack_330 + dStack_330;
  dVar173 = (dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[2] * -4.0) * dStack_520 +
            (dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[5] * -4.0) * dStack_508 +
            (dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[8] * -4.0) * dStack_4f0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar173;
  dVar172 = dStack_330 * -2.0;
  dVar163 = dStack_308 * -2.0;
  dVar91 = local_338 * -2.0;
  dVar171 = dStack_330 + dStack_330;
  dVar384 = local_338 + local_338;
  dVar173 = dVar173 + (dVar172 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] +
                       dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[2] +
                      dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[0]) * dStack_520 +
                      (dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3] +
                      dVar172 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * dStack_508 +
                      (dVar172 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[7] +
                       dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[8] +
                      dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6]) * dStack_4f0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar173;
  dVar163 = dStack_510 * -2.0;
  dVar91 = dStack_4f8 * -2.0;
  dVar558 = local_528 * -2.0;
  dVar172 = dStack_308 + dStack_308;
  dVar173 = dVar173 + (dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] +
                       dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[2] +
                      dVar558 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0]) * dStack_330 +
                      (dVar558 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[5]) * dStack_318 +
                      (dVar558 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7]) * -2.0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar173;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar173 + (dVar384 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[0] +
                   dVar172 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[2] +
                   dVar171 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[1]) * local_528 +
                   (dVar171 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[4] +
                    dVar172 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5] +
                   dVar384 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[3]) * dStack_510 +
                   dStack_4f8 *
                   (dVar384 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6] +
                   dVar171 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[7] +
                   dVar172 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[8]);
  dVar171 = dStack_350 + dStack_350;
  dVar384 = dStack_330 + dStack_330;
  dVar172 = dStack_380 + dStack_380;
  dVar172 = (dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
            dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * dStack_520 +
            (dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
            dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * dStack_508 +
            (dVar172 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
            dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * dStack_4f0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar172;
  dVar173 = local_338 * -2.0;
  dVar163 = local_388 * -2.0;
  dVar171 = local_338 + local_338;
  dVar384 = local_388 + local_388;
  dVar172 = dVar172 + (dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] +
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] * -4.0 +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0]) * dStack_520 +
                      (dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] * -4.0) * dStack_508 +
                      (dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[7] +
                       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8] * -4.0 +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6]) * dStack_4f0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar172;
  dVar173 = dStack_510 * -2.0;
  dVar163 = dStack_4f8 * -2.0;
  dVar91 = local_528 * -2.0;
  dVar172 = dVar172 + (dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] +
                       dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[2] +
                      dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[0]) * dStack_380 +
                      (dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3] +
                      dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * dStack_330 +
                      (dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8] +
                      dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7]) * dStack_350;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar172;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar172 + (dVar384 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[0] +
                   (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[2] * 4.0 +
                   dVar171 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[1]) * local_528 +
                   (dVar171 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[4] +
                    (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[5] * 4.0 +
                   dVar384 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[3]) * dStack_510 +
                   dStack_4f8 *
                   (dVar384 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6] +
                   dVar171 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[7] +
                   (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[8] * 4.0);
  dVar171 = dStack_3a0 + dStack_3a0;
  dVar384 = (double)local_558 + (double)local_558;
  dVar172 = ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[0] * 4.0 +
            dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * dStack_520 +
            ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] * 4.0 +
            dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5]) * dStack_508 +
            ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] * 4.0 +
            dVar384 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
            dVar171 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) * dStack_4f0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar172;
  dVar384 = dStack_3a8 * -2.0;
  dVar173 = (double)local_558 * -2.0;
  dVar171 = (double)local_558 + (double)local_558;
  dVar172 = dVar172 + ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1] * 4.0 +
                       dVar384 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[2] +
                      dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0]) * dStack_520 +
                      (dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4] * 4.0 +
                      dVar384 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * dStack_508 +
                      ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] * 4.0 +
                       dVar384 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[8] +
                      dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6]) * dStack_4f0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar172;
  dVar173 = dStack_510 * -2.0;
  dVar163 = dStack_4f8 * -2.0;
  dVar91 = local_528 * -2.0;
  dVar384 = dStack_3a8 + dStack_3a8;
  dVar172 = dVar172 + (dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] +
                       dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[2] +
                      dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[0]) * 2.0 +
                      (dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3] +
                      dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]) * (double)local_558 +
                      (dVar91 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] +
                      dVar163 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8] +
                      dVar173 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7]) * dStack_3a0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar172;
  auVar137 = _DAT_0025d240;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = dVar172 + (dVar171 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[0] +
                   dVar384 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[2] +
                   (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[1] * -4.0) * local_528 +
                   (dVar171 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[3] +
                   dVar384 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[5] +
                   (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[4] * -4.0) * dStack_510 +
                   dStack_4f8 *
                   (dVar171 * (local_440->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6] +
                   (local_440->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[7] * -4.0 +
                   dVar384 * (local_440->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[8]);
  dVar171 = (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
            m_data.array[8];
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [1] = (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[4];
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [2] = dVar171;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [6] = (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[9];
  dVar171 = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[8];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar171;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar171 = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[8];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar171;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar171 = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar171;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  auVar98._8_8_ = dStack_520;
  auVar98._0_8_ = local_528;
  auVar98._16_8_ = dStack_518;
  auVar98._24_8_ = dStack_510;
  auVar98._32_8_ = dStack_508;
  auVar98._40_8_ = dStack_500;
  auVar98._48_8_ = dStack_4f8;
  auVar98._56_8_ = dStack_4f0;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array.
  _0_64_ = vpermpd_avx512f(auVar137,auVar98);
  auVar117._8_8_ = 0x4000000000000000;
  auVar117._0_8_ = local_558;
  auVar117._16_8_ = dStack_3c8;
  auVar117._24_8_ = 0xc000000000000000;
  auVar117._32_8_ = local_558;
  auVar117._40_8_ = dStack_3b0;
  auVar117._48_8_ = dStack_3a8;
  auVar117._56_8_ = dStack_3a0;
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array.
  _0_64_ = vpermpd_avx512f(auVar137,auVar117);
  auVar124._16_8_ = 0xc000000000000000;
  auVar124._0_16_ = auVar143;
  auVar124._24_8_ = local_338;
  auVar124._32_8_ = dStack_330;
  auVar124._40_8_ = local_420;
  auVar124._48_8_ = 0x4000000000000000;
  auVar124._56_8_ = dStack_350;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array.
  _0_64_ = vpermpd_avx512f(auVar137,auVar124);
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       local_528;
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[1] =
       dStack_520;
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       dStack_518;
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       dStack_510;
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       dStack_508;
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       dStack_500;
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[6] =
       dStack_4f8;
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7] =
       dStack_4f0;
  auVar131._16_8_ = dStack_350;
  auVar131._0_16_ = auVar138;
  auVar131._24_8_ = dStack_330;
  auVar131._32_8_ = dStack_318;
  auVar131._40_8_ = 0x4000000000000000;
  auVar131._48_8_ = dStack_308;
  auVar131._56_8_ = 0xc000000000000000;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array.
  _0_64_ = vpermpd_avx512f(auVar137,auVar131);
  local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       local_4e8;
  local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       local_4e8;
  local_1c8 = local_338;
  dStack_1c0 = dStack_330;
  dStack_1b0 = dStack_330;
  dStack_1a0 = 2.0;
  dStack_190 = -2.0;
  local_218 = local_388;
  dStack_210 = dStack_380;
  local_208 = -2.0;
  dStack_200 = local_338;
  dStack_1f8 = dStack_330;
  local_1e8 = 2.0;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       dStack_348;
  local_1d8 = dStack_348;
  dStack_260 = 2.0;
  dStack_250 = -2.0;
  dStack_240 = dStack_3b0;
  local_238 = dStack_3a8;
  dStack_230 = dStack_3a0;
  local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       dStack_398;
  local_228 = dStack_398;
  local_2f0._0_8_ = &dStack_518;
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y1P;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2a8 = y1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_3f8 = (double)local_558;
  local_3d8 = (double)local_558;
  dStack_3b8 = (double)local_558;
  dStack_370 = local_338;
  dStack_368 = dStack_330;
  dStack_360 = local_420;
  dStack_328 = dStack_350;
  local_2f8 = dStack_318;
  local_2f0._16_8_ = &local_528;
  local_2b8 = (double *)local_2f0._0_8_;
  local_288 = dStack_350;
  local_268 = (double)local_558;
  local_258 = dStack_3c8;
  dStack_248 = (double)local_558;
  dStack_1f0 = local_420;
  dStack_1e0 = dStack_350;
  local_1b8 = dStack_350;
  dStack_1a8 = dStack_318;
  local_198 = dStack_308;
  local_188 = dStack_318;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       dStack_318;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_2f0._0_8_ = &dStack_518;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_558 = (SrcEvaluatorType *)*local_568.data;
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2c0 = y2P;
  local_2a8 = y2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = &local_528;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_2f0._0_8_ = &dStack_328;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  auVar99._8_8_ = dStack_518;
  auVar99._0_8_ = dStack_520;
  auVar141 = vmovhpd_avx(auVar99,dStack_508);
  dVar171 = *local_568.data;
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xc] = (double)local_558 + dVar171;
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar187._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar187._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar241._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar241._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar331._0_8_ = dStack_4f0 * auVar151._0_8_;
  auVar331._8_8_ = dStack_4f0 * auVar151._8_8_;
  auVar386._0_8_ = dStack_4f0 * auVar152._0_8_;
  auVar386._8_8_ = dStack_4f0 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar187,auVar241);
  auVar242._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar242._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar242,auVar331);
  auVar332._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar332._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar332,auVar386);
  auVar477._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar477._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar387._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar387._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar477,auVar387);
  dVar171 = (double)local_558 + dVar171 +
            ((dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
                       .m_data.array[0x19]) -
            dStack_4f0 *
            (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
            array[0x1a]) *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[8] +
            auVar151._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[0] +
            auVar152._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[2] +
            auVar145._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[4] +
            auVar141._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[6] +
            auVar151._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[1] +
            auVar152._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[3] +
            auVar145._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[5] +
            auVar141._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[7];
  auVar100._8_8_ = dStack_518;
  auVar100._0_8_ = dStack_520;
  auVar141 = vmovhpd_avx(auVar100,dStack_508);
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xc] = dVar171;
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar188._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar188._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar388._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar388._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar243._0_8_ = dStack_4f0 * auVar151._0_8_;
  auVar243._8_8_ = dStack_4f0 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar188,auVar243);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar244._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar244._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar388,auVar244);
  auVar333._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar333._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar389._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar389._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar478._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar478._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar333,auVar478);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar479._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar479._8_8_ = dStack_4f0 * auVar141._8_8_;
  local_2f0._16_8_ = &local_338;
  auVar141 = vsubpd_avx(auVar389,auVar479);
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y1P;
  local_2a8 = y1P;
  local_2a0 = 3;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xc] = dVar171 + ((dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                m_storage.m_data.array[0x18] +
                     dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x19]) -
                    dStack_4f0 *
                    (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x1a]) *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[8] +
                    auVar151._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[0] +
                    auVar152._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[2] +
                    auVar145._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[4] +
                    auVar141._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[6] +
                    auVar151._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[1] +
                    auVar152._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[3] +
                    auVar145._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[5] +
                    auVar141._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[7];
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_2f0._0_8_ = &dStack_518;
  local_2f0._16_8_ = &local_528;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data;
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y1P;
  local_2a8 = y1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  local_38 = &local_4d8;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_1c8;
  local_2f0._0_8_ = &dStack_328;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_188 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_1c8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_1b8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_1a8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_198 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_1c0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_1b0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_1a0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_190;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_2f0._16_8_ = &local_338;
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y2P;
  local_2a8 = y2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_2f0._0_8_ = &dStack_518;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_2f0._16_8_ = &local_528;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y2P;
  local_2a8 = y2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[7];
  dVar171 = *local_568.data +
            (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xc];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar132._8_8_ = dStack_328;
  auVar132._0_8_ = dStack_330;
  auVar141 = vmovhpd_avx(auVar132,dStack_318);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar189._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar189._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar245._0_8_ = dStack_300 * auVar151._0_8_;
  auVar245._8_8_ = dStack_300 * auVar151._8_8_;
  auVar334._0_8_ = dStack_300 * auVar152._0_8_;
  auVar334._8_8_ = dStack_300 * auVar152._8_8_;
  auVar390._0_8_ = dStack_300 * auVar145._0_8_;
  auVar390._8_8_ = dStack_300 * auVar145._8_8_;
  auVar151 = vsubpd_avx(auVar189,auVar245);
  auVar246._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar246._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar246,auVar334);
  auVar335._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar335._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar335,auVar390);
  auVar480._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar480._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar391._0_8_ = dStack_300 * auVar141._0_8_;
  auVar391._8_8_ = dStack_300 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar480,auVar391);
  dVar171 = dVar171 + ((dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_300 *
                      (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar101._8_8_ = dStack_518;
  auVar101._0_8_ = dStack_520;
  auVar141 = vmovhpd_avx(auVar101,dStack_508);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar190._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar190._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar247._0_8_ = dStack_4f0 * auVar151._0_8_;
  auVar247._8_8_ = dStack_4f0 * auVar151._8_8_;
  auVar336._0_8_ = dStack_4f0 * auVar152._0_8_;
  auVar336._8_8_ = dStack_4f0 * auVar152._8_8_;
  auVar392._0_8_ = dStack_4f0 * auVar145._0_8_;
  auVar392._8_8_ = dStack_4f0 * auVar145._8_8_;
  auVar151 = vsubpd_avx(auVar190,auVar247);
  auVar248._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar248._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar248,auVar336);
  auVar337._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar337._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar337,auVar392);
  auVar481._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar481._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar393._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar393._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar481,auVar393);
  dVar171 = dVar171 + ((dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_4f0 *
                      (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_188 +
                      auVar151._0_8_ * local_1c8 + auVar152._0_8_ * local_1b8 +
                      auVar145._0_8_ * dStack_1a8 + auVar141._0_8_ * local_198 +
                      auVar151._8_8_ * dStack_1c0 + auVar152._8_8_ * dStack_1b0 +
                      auVar145._8_8_ * dStack_1a0 + auVar141._8_8_ * dStack_190;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar133._8_8_ = dStack_328;
  auVar133._0_8_ = dStack_330;
  auVar141 = vmovhpd_avx(auVar133,dStack_318);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar191._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar191._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar249._0_8_ = dStack_300 * auVar151._0_8_;
  auVar249._8_8_ = dStack_300 * auVar151._8_8_;
  auVar338._0_8_ = dStack_300 * auVar152._0_8_;
  auVar338._8_8_ = dStack_300 * auVar152._8_8_;
  auVar394._0_8_ = dStack_300 * auVar145._0_8_;
  auVar394._8_8_ = dStack_300 * auVar145._8_8_;
  auVar151 = vsubpd_avx(auVar191,auVar249);
  auVar250._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar250._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar250,auVar338);
  auVar339._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar339._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar339,auVar394);
  auVar482._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar482._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar395._0_8_ = dStack_300 * auVar141._0_8_;
  auVar395._8_8_ = dStack_300 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar482,auVar395);
  local_2f0._16_8_ = &local_388;
  dVar171 = dVar171 + ((dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_300 *
                      (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar102._8_8_ = dStack_518;
  auVar102._0_8_ = dStack_520;
  auVar141 = vmovhpd_avx(auVar102,dStack_508);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar192._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar192._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar396._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar396._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar251._0_8_ = dStack_4f0 * auVar151._0_8_;
  auVar251._8_8_ = dStack_4f0 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar192,auVar251);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar252._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar252._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar396,auVar252);
  auVar340._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar340._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar397._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar397._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar483._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar483._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar340,auVar483);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar484._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar484._8_8_ = dStack_4f0 * auVar141._8_8_;
  local_2f0._0_8_ = &uStack_378;
  auVar141 = vsubpd_avx(auVar397,auVar484);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171 + ((dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   dStack_4f0 *
                   (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y1P;
  local_2a8 = y1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_2f0._16_8_ = &local_528;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_2f0._0_8_ = &dStack_518;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data;
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y1P;
  local_2a8 = y1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_218;
  local_2f0._16_8_ = &local_388;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_1d8 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_218 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_208 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_1f8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_1e8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_210 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_200 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_1f0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_1e0;
  local_2f0._0_8_ = &uStack_378;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y2P;
  local_2a8 = y2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_2f0._16_8_ = &local_528;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_2f0._0_8_ = &dStack_518;
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y2P;
  local_2a8 = y2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_128;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  dVar171 = *local_568.data +
            (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xc];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar125._8_8_ = uStack_378;
  auVar125._0_8_ = dStack_380;
  auVar141 = vmovhpd_avx(auVar125,dStack_368);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar193._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar193._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar253._0_8_ = dStack_350 * auVar151._0_8_;
  auVar253._8_8_ = dStack_350 * auVar151._8_8_;
  auVar341._0_8_ = dStack_350 * auVar152._0_8_;
  auVar341._8_8_ = dStack_350 * auVar152._8_8_;
  auVar398._0_8_ = dStack_350 * auVar145._0_8_;
  auVar398._8_8_ = dStack_350 * auVar145._8_8_;
  auVar151 = vsubpd_avx(auVar193,auVar253);
  auVar254._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar254._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar254,auVar341);
  auVar342._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar342._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar342,auVar398);
  auVar485._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar485._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar399._0_8_ = dStack_350 * auVar141._0_8_;
  auVar399._8_8_ = dStack_350 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar485,auVar399);
  dVar171 = dVar171 + ((dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_350 *
                      (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar103._8_8_ = dStack_518;
  auVar103._0_8_ = dStack_520;
  auVar141 = vmovhpd_avx(auVar103,dStack_508);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar194._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar194._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar255._0_8_ = dStack_4f0 * auVar151._0_8_;
  auVar255._8_8_ = dStack_4f0 * auVar151._8_8_;
  auVar343._0_8_ = dStack_4f0 * auVar152._0_8_;
  auVar343._8_8_ = dStack_4f0 * auVar152._8_8_;
  auVar400._0_8_ = dStack_4f0 * auVar145._0_8_;
  auVar400._8_8_ = dStack_4f0 * auVar145._8_8_;
  auVar151 = vsubpd_avx(auVar194,auVar255);
  auVar256._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar256._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar256,auVar343);
  auVar344._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar344._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar344,auVar400);
  auVar486._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar486._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar401._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar401._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar486,auVar401);
  dVar171 = dVar171 + ((dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_4f0 *
                      (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_1d8 +
                      auVar151._0_8_ * local_218 + auVar152._0_8_ * local_208 +
                      auVar145._0_8_ * dStack_1f8 + auVar141._0_8_ * local_1e8 +
                      auVar151._8_8_ * dStack_210 + auVar152._8_8_ * dStack_200 +
                      auVar145._8_8_ * dStack_1f0 + auVar141._8_8_ * dStack_1e0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar126._8_8_ = uStack_378;
  auVar126._0_8_ = dStack_380;
  auVar141 = vmovhpd_avx(auVar126,dStack_368);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar195._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar195._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar257._0_8_ = dStack_350 * auVar151._0_8_;
  auVar257._8_8_ = dStack_350 * auVar151._8_8_;
  auVar345._0_8_ = dStack_350 * auVar152._0_8_;
  auVar345._8_8_ = dStack_350 * auVar152._8_8_;
  auVar402._0_8_ = dStack_350 * auVar145._0_8_;
  auVar402._8_8_ = dStack_350 * auVar145._8_8_;
  auVar151 = vsubpd_avx(auVar195,auVar257);
  auVar258._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar258._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar258,auVar345);
  auVar346._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar346._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar346,auVar402);
  auVar487._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar487._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar403._0_8_ = dStack_350 * auVar141._0_8_;
  auVar403._8_8_ = dStack_350 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar487,auVar403);
  local_2f0._16_8_ = &local_3d8;
  dVar171 = dVar171 + ((dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_350 *
                      (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar104._8_8_ = dStack_518;
  auVar104._0_8_ = dStack_520;
  auVar141 = vmovhpd_avx(auVar104,dStack_508);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar196._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar196._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar404._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar404._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar259._0_8_ = dStack_4f0 * auVar151._0_8_;
  auVar259._8_8_ = dStack_4f0 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar196,auVar259);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar260._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar260._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar404,auVar260);
  auVar347._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar347._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar405._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar405._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar488._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar488._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar347,auVar488);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar489._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar489._8_8_ = dStack_4f0 * auVar141._8_8_;
  local_2f0._0_8_ = &dStack_3c8;
  auVar141 = vsubpd_avx(auVar405,auVar489);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171 + ((dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   dStack_4f0 *
                   (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y1P;
  local_2a8 = y1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_2f0._0_8_ = &dStack_518;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data;
  local_2f0._16_8_ = &local_528;
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y1P;
  local_2a8 = y1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_268;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_228 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_268 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_258 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_248 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_238 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_260 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_250 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_240 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_230;
  local_2f0._16_8_ = &local_3d8;
  local_2f0._0_8_ = &dStack_3c8;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y2P;
  local_2a8 = y2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_2f0._16_8_ = &local_528;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_568.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_2f0._0_8_ = &dStack_518;
  local_2f0._24_16_ = ZEXT816(2);
  local_2c8 = 1;
  local_2c0 = y2P;
  local_2a8 = y2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_178;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  dVar171 = *local_568.data +
            (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xc];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar118._8_8_ = dStack_3c8;
  auVar118._0_8_ = uStack_3d0;
  auVar141 = vmovhpd_avx(auVar118,dStack_3b8);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar197._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar197._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar490._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar490._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar261._0_8_ = dStack_3a0 * auVar151._0_8_;
  auVar261._8_8_ = dStack_3a0 * auVar151._8_8_;
  auVar406._0_8_ = dStack_3a0 * auVar152._0_8_;
  auVar406._8_8_ = dStack_3a0 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar197,auVar261);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar262._0_8_ = dStack_3a0 * auVar141._0_8_;
  auVar262._8_8_ = dStack_3a0 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar490,auVar262);
  auVar348._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar348._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar348,auVar406);
  auVar407._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar407._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar491._0_8_ = dStack_3a0 * auVar141._0_8_;
  auVar491._8_8_ = dStack_3a0 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar407,auVar491);
  dVar171 = dVar171 + ((dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_3a0 *
                      (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar105._8_8_ = dStack_518;
  auVar105._0_8_ = dStack_520;
  auVar141 = vmovhpd_avx(auVar105,dStack_508);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar198._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar198._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar492._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar492._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar263._0_8_ = dStack_4f0 * auVar151._0_8_;
  auVar263._8_8_ = dStack_4f0 * auVar151._8_8_;
  auVar408._0_8_ = dStack_4f0 * auVar152._0_8_;
  auVar408._8_8_ = dStack_4f0 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar198,auVar263);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar264._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar264._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar492,auVar264);
  auVar349._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar349._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar349,auVar408);
  auVar409._0_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar409._8_8_ =
       dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar493._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar493._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar409,auVar493);
  dVar171 = dVar171 + ((dVar384 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_4f0 *
                      (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_228 +
                      auVar151._0_8_ * local_268 + auVar152._0_8_ * local_258 +
                      auVar145._0_8_ * dStack_248 + auVar141._0_8_ * local_238 +
                      auVar151._8_8_ * dStack_260 + auVar152._8_8_ * dStack_250 +
                      auVar145._8_8_ * dStack_240 + auVar141._8_8_ * dStack_230;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar119._8_8_ = dStack_3c8;
  auVar119._0_8_ = uStack_3d0;
  auVar141 = vmovhpd_avx(auVar119,dStack_3b8);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar199._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar199._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar494._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar494._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar265._0_8_ = dStack_3a0 * auVar151._0_8_;
  auVar265._8_8_ = dStack_3a0 * auVar151._8_8_;
  auVar410._0_8_ = dStack_3a0 * auVar152._0_8_;
  auVar410._8_8_ = dStack_3a0 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar199,auVar265);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar266._0_8_ = dStack_3a0 * auVar141._0_8_;
  auVar266._8_8_ = dStack_3a0 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar494,auVar266);
  auVar350._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar350._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar350,auVar410);
  auVar411._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar411._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar495._0_8_ = dStack_3a0 * auVar141._0_8_;
  auVar495._8_8_ = dStack_3a0 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar411,auVar495);
  dVar171 = dVar171 + ((dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_3a0 *
                      (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171;
  auVar106._8_8_ = dStack_518;
  auVar106._0_8_ = dStack_520;
  auVar141 = vmovhpd_avx(auVar106,dStack_508);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar200._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar200._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar229._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar229._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar267._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar267._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar412._0_8_ = dStack_4f0 * auVar151._0_8_;
  auVar412._8_8_ = dStack_4f0 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar200,auVar412);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar413._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar413._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar229,auVar413);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar414._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar414._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar267,auVar414);
  auVar415._0_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar415._8_8_ =
       dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar496._0_8_ = dStack_4f0 * auVar141._0_8_;
  auVar496._8_8_ = dStack_4f0 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar415,auVar496);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = dVar171 + ((dVar384 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   dStack_4f0 *
                   (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_2f0._0_8_ = &local_528;
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_2c0 = z1P;
  local_2a8 = z1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_558 = (SrcEvaluatorType *)*local_568.data;
  local_2f0._0_8_ = &local_528;
  local_2f0._24_16_ = ZEXT816(0) << 0x20;
  local_2c8 = 1;
  local_2c0 = z2P;
  local_2a8 = z2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  auVar107._8_8_ = dStack_510;
  auVar107._0_8_ = dStack_518;
  auVar141 = vmovhpd_avx(auVar107,dStack_500);
  dVar171 = *local_568.data;
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = (double)local_558 + dVar171;
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar201._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar201._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar268._0_8_ = local_4e8 * auVar141._0_8_;
  auVar268._8_8_ = local_4e8 * auVar141._8_8_;
  auVar351._0_8_ = local_4e8 * auVar151._0_8_;
  auVar351._8_8_ = local_4e8 * auVar151._8_8_;
  auVar497._0_8_ = local_4e8 * auVar152._0_8_;
  auVar497._8_8_ = local_4e8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar201,auVar268);
  auVar269._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar269._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar269,auVar351);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar544._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar544._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar352._0_8_ = local_4e8 * auVar141._0_8_;
  auVar352._8_8_ = local_4e8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar544,auVar352);
  auVar416._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar416._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar145 = vsubpd_avx(auVar416,auVar497);
  dVar171 = (double)local_558 + dVar171 +
            ((dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
                       .m_data.array[0x19]) -
            local_4e8 *
            (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
            array[0x1a]) *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[8] +
            auVar151._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[0] +
            auVar152._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[2] +
            auVar141._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[4] +
            auVar145._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[6] +
            auVar151._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[1] +
            auVar152._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[3] +
            auVar141._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[5] +
            auVar145._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[7];
  auVar108._8_8_ = dStack_510;
  auVar108._0_8_ = dStack_518;
  auVar141 = vmovhpd_avx(auVar108,dStack_500);
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = dVar171;
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar202._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar202._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar230._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar230._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar270._0_8_ = auVar151._0_8_ * local_4e8;
  auVar270._8_8_ = auVar151._8_8_ * local_4e8;
  auVar151 = vsubpd_avx(auVar202,auVar270);
  auVar271._0_8_ = auVar152._0_8_ * local_4e8;
  auVar271._8_8_ = auVar152._8_8_ * local_4e8;
  auVar152 = vsubpd_avx(auVar230,auVar271);
  auVar272._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar272._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar353._0_8_ = auVar145._0_8_ * local_4e8;
  auVar353._8_8_ = auVar145._8_8_ * local_4e8;
  auVar170._0_8_ = auVar141._0_8_ * local_4e8;
  auVar170._8_8_ = auVar141._8_8_ * local_4e8;
  auVar141 = vsubpd_avx(auVar272,auVar353);
  auVar354._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar354._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar145 = vsubpd_avx(auVar354,auVar170);
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = dVar171 + ((dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                m_storage.m_data.array[0x18] +
                     dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x19]) -
                    local_4e8 *
                    (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x1a]) *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[8] +
                    auVar151._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[0] +
                    auVar152._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[2] +
                    auVar141._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[4] +
                    auVar145._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[6] +
                    auVar151._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[1] +
                    auVar152._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[3] +
                    auVar141._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[5] +
                    auVar145._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[7];
  local_2f0._0_8_ = &local_338;
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_2c0 = z1P;
  local_2a8 = z1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data;
  local_2f0._0_8_ = &local_528;
  local_2f0._24_16_ = ZEXT816(0) << 0x20;
  local_2c8 = 1;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2c0 = z1P;
  local_2a8 = z1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_1c8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_188 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_1c8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_1b8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_1a8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_198 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_1c0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_1b0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_1a0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_190;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_2f0._0_8_ = &local_338;
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_2c0 = z2P;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2a8 = z2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_2f0._0_8_ = &local_528;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2c0 = z2P;
  local_2a8 = z2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[7];
  dVar171 = *local_568.data +
            (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar134._8_8_ = dStack_320;
  auVar134._0_8_ = dStack_328;
  auVar141 = vmovhpd_avx(auVar134,uStack_310);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar203._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar203._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar273._0_8_ = local_2f8 * auVar151._0_8_;
  auVar273._8_8_ = local_2f8 * auVar151._8_8_;
  auVar355._0_8_ = local_2f8 * auVar152._0_8_;
  auVar355._8_8_ = local_2f8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar203,auVar273);
  auVar274._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar274._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar274,auVar355);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar498._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar498._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar356._0_8_ = local_2f8 * auVar141._0_8_;
  auVar356._8_8_ = local_2f8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar498,auVar356);
  auVar417._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar417._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar499._0_8_ = local_2f8 * auVar141._0_8_;
  auVar499._8_8_ = local_2f8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar417,auVar499);
  dVar171 = dVar171 + ((dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      local_2f8 *
                      (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar109._8_8_ = dStack_510;
  auVar109._0_8_ = dStack_518;
  auVar141 = vmovhpd_avx(auVar109,dStack_500);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar204._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar204._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar275._0_8_ = local_4e8 * auVar151._0_8_;
  auVar275._8_8_ = local_4e8 * auVar151._8_8_;
  auVar357._0_8_ = local_4e8 * auVar152._0_8_;
  auVar357._8_8_ = local_4e8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar204,auVar275);
  auVar276._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar276._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar276,auVar357);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar500._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar500._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar358._0_8_ = local_4e8 * auVar141._0_8_;
  auVar358._8_8_ = local_4e8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar500,auVar358);
  auVar418._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar418._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar501._0_8_ = local_4e8 * auVar141._0_8_;
  auVar501._8_8_ = local_4e8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar418,auVar501);
  dVar171 = dVar171 + ((dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      local_4e8 *
                      (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_188 +
                      auVar151._0_8_ * local_1c8 + auVar152._0_8_ * local_1b8 +
                      auVar145._0_8_ * dStack_1a8 + auVar141._0_8_ * local_198 +
                      auVar151._8_8_ * dStack_1c0 + auVar152._8_8_ * dStack_1b0 +
                      auVar145._8_8_ * dStack_1a0 + auVar141._8_8_ * dStack_190;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar135._8_8_ = dStack_320;
  auVar135._0_8_ = dStack_328;
  auVar141 = vmovhpd_avx(auVar135,uStack_310);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar205._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar205._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar277._0_8_ = local_2f8 * auVar151._0_8_;
  auVar277._8_8_ = local_2f8 * auVar151._8_8_;
  auVar359._0_8_ = local_2f8 * auVar152._0_8_;
  auVar359._8_8_ = local_2f8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar205,auVar277);
  auVar278._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar278._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar278,auVar359);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar502._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar502._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar360._0_8_ = local_2f8 * auVar141._0_8_;
  auVar360._8_8_ = local_2f8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar502,auVar360);
  auVar419._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar419._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar503._0_8_ = local_2f8 * auVar141._0_8_;
  auVar503._8_8_ = local_2f8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar419,auVar503);
  local_2f0._0_8_ = &local_388;
  dVar171 = dVar171 + ((dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      local_2f8 *
                      (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar110._8_8_ = dStack_510;
  auVar110._0_8_ = dStack_518;
  auVar141 = vmovhpd_avx(auVar110,dStack_500);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar206._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar206._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar231._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar231._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar279._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar279._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar420._0_8_ = local_4e8 * auVar151._0_8_;
  auVar420._8_8_ = local_4e8 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar206,auVar420);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar421._0_8_ = local_4e8 * auVar141._0_8_;
  auVar421._8_8_ = local_4e8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar231,auVar421);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar422._0_8_ = local_4e8 * auVar141._0_8_;
  auVar422._8_8_ = local_4e8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar279,auVar422);
  auVar423._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar423._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar504._0_8_ = local_4e8 * auVar141._0_8_;
  auVar504._8_8_ = local_4e8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar423,auVar504);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171 + ((dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   local_4e8 *
                   (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_2c0 = z1P;
  local_2a8 = z1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data;
  local_2f0._0_8_ = &local_528;
  local_2f0._24_16_ = ZEXT816(0) << 0x20;
  local_2c8 = 1;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2c0 = z1P;
  local_2a8 = z1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_218;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_1d8 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_218 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_208 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_1f8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_1e8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_210 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_200 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_1f0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_1e0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_2f0._0_8_ = &local_388;
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_2c0 = z2P;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2a8 = z2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_2f0._0_8_ = &local_528;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2c0 = z2P;
  local_2a8 = z2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_128;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  dVar171 = *local_568.data +
            (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar127._8_8_ = dStack_370;
  auVar127._0_8_ = uStack_378;
  auVar141 = vmovhpd_avx(auVar127,dStack_360);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar207._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar207._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar280._0_8_ = dStack_348 * auVar151._0_8_;
  auVar280._8_8_ = dStack_348 * auVar151._8_8_;
  auVar361._0_8_ = dStack_348 * auVar152._0_8_;
  auVar361._8_8_ = dStack_348 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar207,auVar280);
  auVar281._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar281._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar281,auVar361);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar505._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar505._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar362._0_8_ = dStack_348 * auVar141._0_8_;
  auVar362._8_8_ = dStack_348 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar505,auVar362);
  auVar424._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar424._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar506._0_8_ = dStack_348 * auVar141._0_8_;
  auVar506._8_8_ = dStack_348 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar424,auVar506);
  dVar171 = dVar171 + ((dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_348 *
                      (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar111._8_8_ = dStack_510;
  auVar111._0_8_ = dStack_518;
  auVar141 = vmovhpd_avx(auVar111,dStack_500);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar208._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar208._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar282._0_8_ = local_4e8 * auVar151._0_8_;
  auVar282._8_8_ = local_4e8 * auVar151._8_8_;
  auVar363._0_8_ = local_4e8 * auVar152._0_8_;
  auVar363._8_8_ = local_4e8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar208,auVar282);
  auVar283._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar283._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar283,auVar363);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar507._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar507._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar364._0_8_ = local_4e8 * auVar141._0_8_;
  auVar364._8_8_ = local_4e8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar507,auVar364);
  auVar425._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar425._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar508._0_8_ = local_4e8 * auVar141._0_8_;
  auVar508._8_8_ = local_4e8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar425,auVar508);
  dVar171 = dVar171 + ((dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      local_4e8 *
                      (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_1d8 +
                      auVar151._0_8_ * local_218 + auVar152._0_8_ * local_208 +
                      auVar145._0_8_ * dStack_1f8 + auVar141._0_8_ * local_1e8 +
                      auVar151._8_8_ * dStack_210 + auVar152._8_8_ * dStack_200 +
                      auVar145._8_8_ * dStack_1f0 + auVar141._8_8_ * dStack_1e0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar128._8_8_ = dStack_370;
  auVar128._0_8_ = uStack_378;
  auVar141 = vmovhpd_avx(auVar128,dStack_360);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar209._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar209._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar284._0_8_ = dStack_348 * auVar151._0_8_;
  auVar284._8_8_ = dStack_348 * auVar151._8_8_;
  auVar365._0_8_ = dStack_348 * auVar152._0_8_;
  auVar365._8_8_ = dStack_348 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar209,auVar284);
  auVar285._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar285._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar152 = vsubpd_avx(auVar285,auVar365);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar509._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar509._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar366._0_8_ = dStack_348 * auVar141._0_8_;
  auVar366._8_8_ = dStack_348 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar509,auVar366);
  auVar426._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar426._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar510._0_8_ = dStack_348 * auVar141._0_8_;
  auVar510._8_8_ = dStack_348 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar426,auVar510);
  local_2f0._0_8_ = &local_3d8;
  dVar171 = dVar171 + ((dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_348 *
                      (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar112._8_8_ = dStack_510;
  auVar112._0_8_ = dStack_518;
  auVar141 = vmovhpd_avx(auVar112,dStack_500);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar210._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar210._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar232._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar232._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar286._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar286._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar427._0_8_ = local_4e8 * auVar151._0_8_;
  auVar427._8_8_ = local_4e8 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar210,auVar427);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar428._0_8_ = local_4e8 * auVar141._0_8_;
  auVar428._8_8_ = local_4e8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar232,auVar428);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar429._0_8_ = local_4e8 * auVar141._0_8_;
  auVar429._8_8_ = local_4e8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar286,auVar429);
  auVar430._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar430._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar511._0_8_ = local_4e8 * auVar141._0_8_;
  auVar511._8_8_ = local_4e8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar430,auVar511);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171 + ((dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   local_4e8 *
                   (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_2c0 = z1P;
  local_2a8 = z1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data;
  local_2f0._0_8_ = &local_528;
  local_2f0._24_16_ = ZEXT816(0) << 0x20;
  local_2c8 = 1;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2c0 = z1P;
  local_2a8 = z1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_268;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_228 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_268 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_258 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_248 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_238 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_260 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_250 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_240 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_230;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_2f0._0_8_ = &local_3d8;
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_2c0 = z2P;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2a8 = z2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_2f0._0_8_ = &local_528;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_568.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_2f0._24_16_ = ZEXT816(0);
  local_2c8 = 1;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2c0 = z2P;
  local_2a8 = z2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = local_2f0._0_8_;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_178;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  dVar171 = *local_568.data +
            (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar120._8_8_ = uStack_3c0;
  auVar120._0_8_ = dStack_3c8;
  auVar141 = vmovhpd_avx(auVar120,dStack_3b0);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar211._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar211._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar512._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar512._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar287._0_8_ = dStack_398 * auVar151._0_8_;
  auVar287._8_8_ = dStack_398 * auVar151._8_8_;
  auVar431._0_8_ = dStack_398 * auVar152._0_8_;
  auVar431._8_8_ = dStack_398 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar211,auVar287);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar288._0_8_ = dStack_398 * auVar141._0_8_;
  auVar288._8_8_ = dStack_398 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar512,auVar288);
  auVar367._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar367._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar367,auVar431);
  auVar432._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar432._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar513._0_8_ = dStack_398 * auVar141._0_8_;
  auVar513._8_8_ = dStack_398 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar432,auVar513);
  local_2f0._0_8_ = &dStack_520;
  dVar171 = dVar171 + ((dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_398 *
                      (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar113._8_8_ = dStack_510;
  auVar113._0_8_ = dStack_518;
  auVar141 = vmovhpd_avx(auVar113,dStack_500);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar212._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar212._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar514._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar514._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar289._0_8_ = local_4e8 * auVar151._0_8_;
  auVar289._8_8_ = local_4e8 * auVar151._8_8_;
  auVar433._0_8_ = local_4e8 * auVar152._0_8_;
  auVar433._8_8_ = local_4e8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar212,auVar289);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar290._0_8_ = local_4e8 * auVar141._0_8_;
  auVar290._8_8_ = local_4e8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar514,auVar290);
  auVar368._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar368._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar368,auVar433);
  auVar434._0_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar434._8_8_ =
       dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar515._0_8_ = local_4e8 * auVar141._0_8_;
  auVar515._8_8_ = local_4e8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar434,auVar515);
  dVar171 = dVar171 + ((dVar384 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      local_4e8 *
                      (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_228 +
                      auVar151._0_8_ * local_268 + auVar152._0_8_ * local_258 +
                      auVar145._0_8_ * dStack_248 + auVar141._0_8_ * local_238 +
                      auVar151._8_8_ * dStack_260 + auVar152._8_8_ * dStack_250 +
                      auVar145._8_8_ * dStack_240 + auVar141._8_8_ * dStack_230;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar121._8_8_ = uStack_3c0;
  auVar121._0_8_ = dStack_3c8;
  auVar141 = vmovhpd_avx(auVar121,dStack_3b0);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar213._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar213._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar516._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar516._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar291._0_8_ = dStack_398 * auVar151._0_8_;
  auVar291._8_8_ = dStack_398 * auVar151._8_8_;
  auVar435._0_8_ = dStack_398 * auVar152._0_8_;
  auVar435._8_8_ = dStack_398 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar213,auVar291);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar292._0_8_ = dStack_398 * auVar141._0_8_;
  auVar292._8_8_ = dStack_398 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar516,auVar292);
  auVar369._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar369._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar369,auVar435);
  auVar436._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar436._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar517._0_8_ = dStack_398 * auVar141._0_8_;
  auVar517._8_8_ = dStack_398 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar436,auVar517);
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  dVar171 = dVar171 + ((dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_398 *
                      (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171;
  auVar114._8_8_ = dStack_510;
  auVar114._0_8_ = dStack_518;
  auVar141 = vmovhpd_avx(auVar114,dStack_500);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar214._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar214._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar233._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar233._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar293._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar293._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar437._0_8_ = local_4e8 * auVar151._0_8_;
  auVar437._8_8_ = local_4e8 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar214,auVar437);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar438._0_8_ = local_4e8 * auVar141._0_8_;
  auVar438._8_8_ = local_4e8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar233,auVar438);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar439._0_8_ = local_4e8 * auVar141._0_8_;
  auVar439._8_8_ = local_4e8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar293,auVar439);
  auVar440._0_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar440._8_8_ =
       dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar518._0_8_ = local_4e8 * auVar141._0_8_;
  auVar518._8_8_ = local_4e8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar440,auVar518);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar171 + ((dVar384 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   local_4e8 *
                   (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x1P;
  local_2a8 = x1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = &local_528;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_2f0._0_8_ = &dStack_520;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_558 = (SrcEvaluatorType *)*local_568.data;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x2P;
  local_2a8 = x2P;
  local_2a0 = 3;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2f0._16_8_ = &local_528;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_2f0._0_8_ = &dStack_330;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  auVar138._8_8_ = dStack_520;
  auVar138._0_8_ = local_528;
  auVar141 = vmovhpd_avx(auVar138,dStack_510);
  dVar171 = *local_568.data;
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = (double)local_558 + dVar171;
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar215._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar215._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar519._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar519._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar294._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar294._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar441._0_8_ = dStack_4f8 * auVar151._0_8_;
  auVar441._8_8_ = dStack_4f8 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar215,auVar294);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar295._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar295._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar519,auVar295);
  auVar370._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar370._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar370,auVar441);
  auVar442._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar442._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar520._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar520._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar442,auVar520);
  dVar171 = (double)local_558 + dVar171 +
            ((dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage
                       .m_data.array[0x19]) -
            dStack_4f8 *
            (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
            array[0x1a]) *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[8] +
            auVar151._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[0] +
            auVar152._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[2] +
            auVar145._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[4] +
            auVar141._0_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[6] +
            auVar151._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[1] +
            auVar152._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[3] +
            auVar145._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[5] +
            auVar141._8_8_ *
            local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
            array[7];
  auVar143._8_8_ = dStack_520;
  auVar143._0_8_ = local_528;
  auVar141 = vmovhpd_avx(auVar143,dStack_510);
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = dVar171;
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar216._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar216._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar234._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar234._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar296._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar296._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar443._0_8_ = dStack_4f8 * auVar151._0_8_;
  auVar443._8_8_ = dStack_4f8 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar216,auVar443);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar444._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar444._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar234,auVar444);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar445._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar445._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar296,auVar445);
  auVar446._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar446._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar521._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar521._8_8_ = dStack_4f8 * auVar141._8_8_;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2f0._16_8_ = &local_338;
  auVar141 = vsubpd_avx(auVar446,auVar521);
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x1P;
  local_2a8 = x1P;
  local_2a0 = 3;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = dVar171 + ((dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                m_storage.m_data.array[0x18] +
                     dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x19]) -
                    dStack_4f8 *
                    (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x1a]) *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[8] +
                    auVar151._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[0] +
                    auVar152._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[2] +
                    auVar145._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[4] +
                    auVar141._0_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[6] +
                    auVar151._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[1] +
                    auVar152._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[3] +
                    auVar145._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[5] +
                    auVar141._8_8_ *
                    local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[7];
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_2f0._0_8_ = &dStack_520;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data;
  local_2f0._16_8_ = &local_528;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x1P;
  local_2a8 = x1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_1c8;
  local_2f0._0_8_ = &dStack_330;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_188 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_1c8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_1b8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_1a8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_198 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_1c0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_1b0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_1a0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_190;
  local_2f0._16_8_ = &local_338;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x2P;
  local_2a8 = x2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_2f0._0_8_ = &dStack_520;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  local_2f0._16_8_ = &local_528;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x2P;
  local_2a8 = x2P;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
              .array[7];
  dVar171 = *local_568.data +
            (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xe];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar129._8_8_ = dStack_330;
  auVar129._0_8_ = local_338;
  auVar141 = vmovhpd_avx(auVar129,dStack_320);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar217._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar217._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar522._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar522._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar297._0_8_ = dStack_308 * auVar151._0_8_;
  auVar297._8_8_ = dStack_308 * auVar151._8_8_;
  auVar447._0_8_ = dStack_308 * auVar152._0_8_;
  auVar447._8_8_ = dStack_308 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar217,auVar297);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar298._0_8_ = dStack_308 * auVar141._0_8_;
  auVar298._8_8_ = dStack_308 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar522,auVar298);
  auVar371._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar371._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar371,auVar447);
  auVar448._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar448._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar523._0_8_ = dStack_308 * auVar141._0_8_;
  auVar523._8_8_ = dStack_308 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar448,auVar523);
  local_2f0._16_8_ = &local_388;
  dVar171 = dVar171 + ((dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_308 *
                      (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar92._8_8_ = dStack_520;
  auVar92._0_8_ = local_528;
  auVar141 = vmovhpd_avx(auVar92,dStack_510);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar218._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar218._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar524._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar524._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar299._0_8_ = dStack_4f8 * auVar151._0_8_;
  auVar299._8_8_ = dStack_4f8 * auVar151._8_8_;
  auVar449._0_8_ = dStack_4f8 * auVar152._0_8_;
  auVar449._8_8_ = dStack_4f8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar218,auVar299);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar300._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar300._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar524,auVar300);
  auVar372._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar372._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar372,auVar449);
  auVar450._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar450._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar525._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar525._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar450,auVar525);
  dVar171 = dVar171 + ((dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_4f8 *
                      (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_188 +
                      auVar151._0_8_ * local_1c8 + auVar152._0_8_ * local_1b8 +
                      auVar145._0_8_ * dStack_1a8 + auVar141._0_8_ * local_198 +
                      auVar151._8_8_ * dStack_1c0 + auVar152._8_8_ * dStack_1b0 +
                      auVar145._8_8_ * dStack_1a0 + auVar141._8_8_ * dStack_190;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar130._8_8_ = dStack_330;
  auVar130._0_8_ = local_338;
  auVar141 = vmovhpd_avx(auVar130,dStack_320);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar219._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar219._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar526._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar526._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar301._0_8_ = dStack_308 * auVar151._0_8_;
  auVar301._8_8_ = dStack_308 * auVar151._8_8_;
  auVar451._0_8_ = dStack_308 * auVar152._0_8_;
  auVar451._8_8_ = dStack_308 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar219,auVar301);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar302._0_8_ = dStack_308 * auVar141._0_8_;
  auVar302._8_8_ = dStack_308 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar526,auVar302);
  auVar373._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar373._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar373,auVar451);
  auVar452._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar452._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar527._0_8_ = dStack_308 * auVar141._0_8_;
  auVar527._8_8_ = dStack_308 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar452,auVar527);
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  dVar171 = dVar171 + ((dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_308 *
                      (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar93._8_8_ = dStack_520;
  auVar93._0_8_ = local_528;
  auVar141 = vmovhpd_avx(auVar93,dStack_510);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar220._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar220._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar235._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar235._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar303._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar303._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar453._0_8_ = dStack_4f8 * auVar151._0_8_;
  auVar453._8_8_ = dStack_4f8 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar220,auVar453);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar454._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar454._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar235,auVar454);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar455._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar455._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar303,auVar455);
  auVar456._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar456._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar528._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar528._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar456,auVar528);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171 + ((dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   dStack_4f8 *
                   (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_2f0._0_8_ = &dStack_380;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x1P;
  local_2a8 = x1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_4d8;
  local_2f0._16_8_ = &local_528;
  local_2f0._0_8_ = &dStack_520;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x1P;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2a8 = x1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_218;
  local_2f0._16_8_ = &local_388;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_1d8 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_218 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_208 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_1f8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_1e8 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_210 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_200 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_1f0 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_1e0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_2f0._0_8_ = &dStack_380;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x2P;
  local_2a8 = x2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_2f0._16_8_ = &local_528;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_2f0._0_8_ = &dStack_520;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x2P;
  local_2a8 = x2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_128;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  dVar171 = *local_568.data +
            (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xe];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar122._8_8_ = dStack_380;
  auVar122._0_8_ = local_388;
  auVar141 = vmovhpd_avx(auVar122,dStack_370);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar221._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar221._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar529._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar529._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar304._0_8_ = dStack_358 * auVar151._0_8_;
  auVar304._8_8_ = dStack_358 * auVar151._8_8_;
  auVar457._0_8_ = dStack_358 * auVar152._0_8_;
  auVar457._8_8_ = dStack_358 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar221,auVar304);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar305._0_8_ = dStack_358 * auVar141._0_8_;
  auVar305._8_8_ = dStack_358 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar529,auVar305);
  auVar374._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar374._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar374,auVar457);
  auVar458._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar458._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar530._0_8_ = dStack_358 * auVar141._0_8_;
  auVar530._8_8_ = dStack_358 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar458,auVar530);
  dVar171 = dVar171 + ((dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_358 *
                      (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar94._8_8_ = dStack_520;
  auVar94._0_8_ = local_528;
  auVar141 = vmovhpd_avx(auVar94,dStack_510);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar222._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar222._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar531._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar531._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar306._0_8_ = dStack_4f8 * auVar151._0_8_;
  auVar306._8_8_ = dStack_4f8 * auVar151._8_8_;
  auVar459._0_8_ = dStack_4f8 * auVar152._0_8_;
  auVar459._8_8_ = dStack_4f8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar222,auVar306);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar307._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar307._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar531,auVar307);
  auVar375._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar375._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar375,auVar459);
  auVar460._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar460._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar532._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar532._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar460,auVar532);
  dVar171 = dVar171 + ((dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_4f8 *
                      (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_1d8 +
                      auVar151._0_8_ * local_218 + auVar152._0_8_ * local_208 +
                      auVar145._0_8_ * dStack_1f8 + auVar141._0_8_ * local_1e8 +
                      auVar151._8_8_ * dStack_210 + auVar152._8_8_ * dStack_200 +
                      auVar145._8_8_ * dStack_1f0 + auVar141._8_8_ * dStack_1e0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar123._8_8_ = dStack_380;
  auVar123._0_8_ = local_388;
  auVar141 = vmovhpd_avx(auVar123,dStack_370);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar223._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar223._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar533._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar533._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar308._0_8_ = dStack_358 * auVar151._0_8_;
  auVar308._8_8_ = dStack_358 * auVar151._8_8_;
  auVar461._0_8_ = dStack_358 * auVar152._0_8_;
  auVar461._8_8_ = dStack_358 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar223,auVar308);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar309._0_8_ = dStack_358 * auVar141._0_8_;
  auVar309._8_8_ = dStack_358 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar533,auVar309);
  auVar376._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar376._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar376,auVar461);
  auVar462._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar462._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar534._0_8_ = dStack_358 * auVar141._0_8_;
  auVar534._8_8_ = dStack_358 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar462,auVar534);
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  dVar171 = dVar171 + ((dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_358 *
                      (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar95._8_8_ = dStack_520;
  auVar95._0_8_ = local_528;
  auVar141 = vmovhpd_avx(auVar95,dStack_510);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  dVar384 = -auVar141._0_8_;
  dVar172 = -auVar141._8_8_;
  auVar224._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar224._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar236._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar236._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar310._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar310._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  local_2f0._16_8_ = &local_3d8;
  auVar463._0_8_ = dStack_4f8 * auVar151._0_8_;
  auVar463._8_8_ = dStack_4f8 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar224,auVar463);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar464._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar464._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar236,auVar464);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar465._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar465._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar310,auVar465);
  auVar466._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar466._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar535._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar535._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar466,auVar535);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171 + ((dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   dStack_4f8 *
                   (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_2f0._0_8_ = &uStack_3d0;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x1P;
  local_2a8 = x1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_2f0._0_8_ = &dStack_520;
  local_2f0._16_8_ = &local_528;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x1P;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_2a8 = x1P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  local_38 = &local_4d8;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_268;
  local_2f0._16_8_ = &local_3d8;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_228 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_268 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_258 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_248 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_238 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_260 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_250 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_240 +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_230;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_2f0._0_8_ = &uStack_3d0;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x2P;
  local_2a8 = x2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_488;
  local_2f0._16_8_ = &local_528;
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_568.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_2f0._0_8_ = &dStack_520;
  local_2f0._24_16_ = ZEXT816(1);
  local_2c8 = 1;
  local_2c0 = x2P;
  local_2a8 = x2P;
  local_2a0 = 3;
  local_578.data = (double *)local_80;
  local_568.data = &local_560;
  local_550.m_dst = (DstEvaluatorType *)&local_578;
  local_550.m_src = (SrcEvaluatorType *)local_2f0;
  local_550.m_functor = (assign_op<double,_double> *)&local_570;
  local_550.m_dstExpr = (DstXprType *)local_80;
  local_2b8 = (double *)local_2f0._0_8_;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_550);
  local_38 = &local_178;
  auVar147 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  local_560 = *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  dVar171 = *local_568.data +
            (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xe];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar115._8_8_ = uStack_3d0;
  auVar115._0_8_ = local_3d8;
  auVar141 = vmovhpd_avx(auVar115,uStack_3c0);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar141 = vxorpd_avx512vl(auVar141,auVar147);
  dVar384 = auVar141._0_8_;
  dVar172 = auVar141._8_8_;
  auVar225._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar225._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar545._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar545._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar311._0_8_ = dStack_3a8 * auVar151._0_8_;
  auVar311._8_8_ = dStack_3a8 * auVar151._8_8_;
  auVar467._0_8_ = dStack_3a8 * auVar152._0_8_;
  auVar467._8_8_ = dStack_3a8 * auVar152._8_8_;
  auVar536._0_8_ = dStack_3a8 * auVar145._0_8_;
  auVar536._8_8_ = dStack_3a8 * auVar145._8_8_;
  auVar151 = vsubpd_avx(auVar225,auVar311);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar312._0_8_ = dStack_3a8 * auVar141._0_8_;
  auVar312._8_8_ = dStack_3a8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar545,auVar312);
  auVar377._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar377._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar152 = vsubpd_avx(auVar377,auVar467);
  auVar468._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar468._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar145 = vsubpd_avx(auVar468,auVar536);
  dVar171 = dVar171 + ((dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_3a8 *
                      (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar141._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar152._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar145._0_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar141._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar152._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar145._8_8_ *
                      local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar96._8_8_ = dStack_520;
  auVar96._0_8_ = local_528;
  auVar141 = vmovhpd_avx(auVar96,dStack_510);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar145 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar146 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar141 = vxorpd_avx512vl(auVar141,auVar147);
  dVar384 = auVar141._0_8_;
  dVar172 = auVar141._8_8_;
  auVar537._0_8_ = dStack_4f8 * auVar145._0_8_;
  auVar537._8_8_ = dStack_4f8 * auVar145._8_8_;
  auVar162._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar162._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar237._0_8_ = dStack_4f8 * auVar151._0_8_;
  auVar237._8_8_ = dStack_4f8 * auVar151._8_8_;
  auVar378._0_8_ = dStack_4f8 * auVar152._0_8_;
  auVar378._8_8_ = dStack_4f8 * auVar152._8_8_;
  auVar469._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar469._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar313._0_8_ = auVar146._0_8_ * dStack_4f8;
  auVar313._8_8_ = auVar146._8_8_ * dStack_4f8;
  auVar141 = vsubpd_avx(auVar162,auVar237);
  auVar238._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar238._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar151 = vsubpd_avx(auVar469,auVar313);
  auVar152 = vsubpd_avx(auVar238,auVar378);
  auVar379._0_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar379._8_8_ =
       dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar379,auVar537);
  dVar171 = dVar171 + ((dVar384 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_4f8 *
                      (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) * local_228 +
                      auVar141._0_8_ * local_268 + auVar152._0_8_ * local_258 +
                      auVar145._0_8_ * dStack_248 + auVar151._0_8_ * local_238 +
                      auVar141._8_8_ * dStack_260 + auVar152._8_8_ * dStack_250 +
                      auVar145._8_8_ * dStack_240 + auVar151._8_8_ * dStack_230;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar116._8_8_ = uStack_3d0;
  auVar116._0_8_ = local_3d8;
  auVar141 = vmovhpd_avx(auVar116,uStack_3c0);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar152 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar141 = vxorpd_avx512vl(auVar141,auVar147);
  dVar384 = auVar141._0_8_;
  dVar172 = auVar141._8_8_;
  auVar226._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar226._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar538._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar538._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar314._0_8_ = dStack_3a8 * auVar151._0_8_;
  auVar314._8_8_ = dStack_3a8 * auVar151._8_8_;
  auVar470._0_8_ = dStack_3a8 * auVar152._0_8_;
  auVar470._8_8_ = dStack_3a8 * auVar152._8_8_;
  auVar151 = vsubpd_avx(auVar226,auVar314);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar315._0_8_ = dStack_3a8 * auVar141._0_8_;
  auVar315._8_8_ = dStack_3a8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar538,auVar315);
  auVar380._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar380._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar145 = vsubpd_avx(auVar380,auVar470);
  auVar471._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar471._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar539._0_8_ = dStack_3a8 * auVar141._0_8_;
  auVar539._8_8_ = dStack_3a8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar471,auVar539);
  dVar171 = dVar171 + ((dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>
                                  ).m_storage.m_data.array[0x18] +
                       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>)
                                 .m_storage.m_data.array[0x19]) -
                      dStack_3a8 *
                      (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x1a]) *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[8] +
                      auVar151._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[0] +
                      auVar152._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[2] +
                      auVar145._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[4] +
                      auVar141._0_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[6] +
                      auVar151._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[1] +
                      auVar152._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[3] +
                      auVar145._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[5] +
                      auVar141._8_8_ *
                      local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171;
  auVar97._8_8_ = dStack_520;
  auVar97._0_8_ = local_528;
  auVar141 = vmovhpd_avx(auVar97,dStack_510);
  auVar151 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 2),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[5]);
  auVar141 = vxorpd_avx512vl(auVar141,auVar147);
  dVar384 = auVar141._0_8_;
  dVar172 = auVar141._8_8_;
  auVar227._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar227._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar239._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar239._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar381._0_8_ = dStack_4f8 * auVar151._0_8_;
  auVar381._8_8_ = dStack_4f8 * auVar151._8_8_;
  auVar151 = vsubpd_avx(auVar227,auVar381);
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 8),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0xb]);
  auVar382._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar382._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar152 = vsubpd_avx(auVar239,auVar382);
  auVar383._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar383._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0xe),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x11]);
  auVar472._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar472._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar145 = vsubpd_avx(auVar383,auVar472);
  auVar473._0_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar473._8_8_ =
       dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar141 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                           m_storage.m_data.array + 0x14),
                         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array[0x17]);
  auVar540._0_8_ = dStack_4f8 * auVar141._0_8_;
  auVar540._8_8_ = dStack_4f8 * auVar141._8_8_;
  auVar141 = vsubpd_avx(auVar473,auVar540);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = dVar171 + ((dVar384 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                               m_storage.m_data.array[0x18] +
                    dVar172 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array[0x19]) -
                   dStack_4f8 *
                   (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                   m_data.array[0x1a]) *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
                   auVar151._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[0] +
                   auVar152._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[2] +
                   auVar145._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[4] +
                   auVar141._0_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[6] +
                   auVar151._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[1] +
                   auVar152._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[3] +
                   auVar145._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[5] +
                   auVar141._8_8_ *
                   local_178.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[7];
  local_578.data = (double *)m11P;
  ppSVar136 = &local_550.m_src;
  local_2f0._16_8_ = -1.0;
  local_570 = 1.0;
  local_40 = 0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  local_2f0._24_8_ = &local_4d8;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  local_558 = *(SrcEvaluatorType **)local_550.m_dst;
  local_40 = 0;
  local_570 = 1.0;
  local_578.data = (double *)m22P;
  local_2f0._16_8_ = -1.0;
  local_80 = ZEXT864(0) << 0x20;
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  local_38 = &local_4d8;
  local_2f0._24_8_ = &local_488;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  local_558 = (SrcEvaluatorType *)
              ((double)local_558 + (double)*(SrcEvaluatorType **)local_550.m_dst);
  local_570 = 1.0;
  local_40 = 0;
  local_2f0._16_8_ = -2.0;
  local_578.data = (double *)m12P;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  local_38 = &local_488;
  local_2f0._24_8_ = &local_488;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = &local_4d8;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  local_2f0._16_8_ = -2.0;
  local_570 = 1.0;
  local_578.data = (double *)m11P;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xf] = (double)local_558 + (double)*(SrcEvaluatorType **)local_550.m_dst;
  local_40 = 0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  local_2f0._24_8_ = local_38;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_1c8;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_188 +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_1c8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_1b8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_1a8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_198 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_1c0 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_1b0 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_1a0 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_190);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst;
  local_578.data = (double *)m22P;
  local_2f0._24_8_ = &local_d8;
  local_570 = 1.0;
  local_2f0._16_8_ = -2.0;
  local_80 = ZEXT864(0) << 0x20;
  local_40 = 0;
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = &local_488;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_570 = 1.0;
  local_40 = 0;
  local_578.data = (double *)m12P;
  local_2f0._24_8_ = &local_d8;
  local_2f0._16_8_ = -2.0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = &local_4d8;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_2f0._24_8_ = &local_488;
  local_2f0._16_8_ = -2.0;
  local_570 = 1.0;
  local_578.data = (double *)m12P;
  local_40 = 0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_1c8;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_188 +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_1c8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_1b8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_1a8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_198 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_1c0 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_1b0 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_1a0 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_190);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_578.data = (double *)m11P;
  local_2f0._24_8_ = &local_4d8;
  local_570 = 1.0;
  local_2f0._16_8_ = -2.0;
  local_40 = 0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_218;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_1d8 +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_218 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_208 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_1f8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_1e8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_210 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_200 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_1f0 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_1e0);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst;
  local_578.data = (double *)m22P;
  local_570 = 1.0;
  local_2f0._24_8_ = &local_128;
  local_80 = ZEXT864(0) << 0x20;
  local_2f0._16_8_ = -2.0;
  local_40 = 0;
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = &local_488;
  local_2f0._24_8_ = &local_128;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_570 = 1.0;
  local_40 = 0;
  local_2f0._16_8_ = -2.0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_578.data = (double *)m12P;
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = &local_4d8;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_2f0._24_8_ = &local_488;
  local_570 = 1.0;
  local_2f0._16_8_ = -2.0;
  local_578.data = (double *)m12P;
  local_40 = 0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_218;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_1d8 +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_218 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_208 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_1f8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_1e8 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_210 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_200 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_1f0 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_1e0);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_570 = 1.0;
  local_578.data = (double *)m11P;
  local_2f0._24_8_ = &local_4d8;
  local_40 = 0;
  local_2f0._16_8_ = -2.0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_268;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_228 +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_268 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_258 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_248 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_238 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_260 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_250 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_240 +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_230);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst;
  local_570 = 1.0;
  local_578.data = (double *)m22P;
  local_2f0._24_8_ = &local_178;
  local_80 = ZEXT864(0) << 0x20;
  local_2f0._16_8_ = -2.0;
  local_40 = 0;
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = &local_488;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_488.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_570 = 1.0;
  local_578.data = (double *)m12P;
  local_2f0._24_8_ = &local_178;
  local_40 = 0;
  local_2f0._16_8_ = -2.0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  local_38 = &local_4d8;
  local_550.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_570 = 1.0;
  local_40 = 0;
  local_2f0._16_8_ = -2.0;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_578.data = (double *)m12P;
  local_2f0._24_8_ = &local_488;
  local_568.data = (double *)local_80;
  local_550.m_dst = (DstEvaluatorType *)ppSVar136;
  local_88 = (DstXprType *)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_578,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_2f0,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_568,&local_570)
  ;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_550.m_dst +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  dVar171 = (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
            m_data.array[0xd];
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [3] = (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[0xc];
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [7] = dVar171;
  (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xb] = (local_530->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
          .array[0xe];
  dVar171 = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar171;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  dVar171 = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar171;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  dVar171 = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar171;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  return local_530;
}

Assistant:

Eigen::Matrix4d
opengv::relative_pose::modules::ge::composeGwithJacobians(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    Eigen::Matrix4d & G_jac1,
    Eigen::Matrix4d & G_jac2,
    Eigen::Matrix4d & G_jac3 )
{
  rotation_t R = math::cayley2rot_reduced(cayley);
  rotation_t R_jac1;
  rotation_t R_jac2;
  rotation_t R_jac3;

  R_jac1(0,0) =  2.0*cayley[0];
  R_jac1(0,1) =  2.0*cayley[1];
  R_jac1(0,2) =  2.0*cayley[2];
  R_jac1(1,0) =  2.0*cayley[1];
  R_jac1(1,1) = -2.0*cayley[0];
  R_jac1(1,2) = -2.0;
  R_jac1(2,0) =  2.0*cayley[2];
  R_jac1(2,1) =  2.0;
  R_jac1(2,2) = -2.0*cayley[0];
  R_jac2(0,0) = -2.0*cayley[1];
  R_jac2(0,1) =  2.0*cayley[0];
  R_jac2(0,2) =  2.0;
  R_jac2(1,0) =  2.0*cayley[0];
  R_jac2(1,1) =  2.0*cayley[1];
  R_jac2(1,2) =  2.0*cayley[2];
  R_jac2(2,0) = -2.0;
  R_jac2(2,1) =  2.0*cayley[2];
  R_jac2(2,2) = -2.0*cayley[1];
  R_jac3(0,0) = -2.0*cayley[2];
  R_jac3(0,1) = -2.0;
  R_jac3(0,2) =  2.0*cayley[0];
  R_jac3(1,0) =  2.0;
  R_jac3(1,1) = -2.0*cayley[2];
  R_jac3(1,2) =  2.0*cayley[1];
  R_jac3(2,0) =  2.0*cayley[0];
  R_jac3(2,1) =  2.0*cayley[1];
  R_jac3(2,2) =  2.0*cayley[2];

  //Fill the matrix G using the precomputed summation terms. Plus Jacobian.
  Eigen::Matrix4d G;
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  G(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  G(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  G(0,0) += temp;
  temp = 2.0*R_jac1.row(2)*yyF*R.row(2).transpose();
  G_jac1(0,0)  = temp;
  temp = -2.0*R_jac1.row(2)*yzF*R.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac1.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = 2.0*R_jac1.row(1)*zzF*R.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = 2.0*R_jac2.row(2)*yyF*R.row(2).transpose();
  G_jac2(0,0)  = temp;
  temp = -2.0*R_jac2.row(2)*yzF*R.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac2.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = 2.0*R_jac2.row(1)*zzF*R.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = 2.0*R_jac3.row(2)*yyF*R.row(2).transpose();
  G_jac3(0,0)  = temp;
  temp = -2.0*R_jac3.row(2)*yzF*R.row(1).transpose();
  G_jac3(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac3.row(1).transpose();
  G_jac3(0,0) += temp;
  temp = 2.0*R_jac3.row(1)*zzF*R.row(1).transpose();
  G_jac3(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  G(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  G(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  G(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  G(0,1) += temp;
  temp = R_jac1.row(2)*yzF*R.row(0).transpose();
  G_jac1(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac1.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = -2.0*R_jac1.row(2)*xyF*R.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = -R_jac1.row(1)*zzF*R.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac1.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = R_jac1.row(1)*zxF*R.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = R.row(1)*zxF*R_jac1.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = R_jac2.row(2)*yzF*R.row(0).transpose();
  G_jac2(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac2.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = -2.0*R_jac2.row(2)*xyF*R.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = -R_jac2.row(1)*zzF*R.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac2.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = R_jac2.row(1)*zxF*R.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = R.row(1)*zxF*R_jac2.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = R_jac3.row(2)*yzF*R.row(0).transpose();
  G_jac3(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac3.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = -2.0*R_jac3.row(2)*xyF*R.row(2).transpose();
  G_jac3(0,1) += temp;
  temp = -R_jac3.row(1)*zzF*R.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac3.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = R_jac3.row(1)*zxF*R.row(2).transpose();
  G_jac3(0,1) += temp;
  temp = R.row(1)*zxF*R_jac3.row(2).transpose();
  G_jac3(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  G(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  G(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  G(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  G(0,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(1).transpose();
  G_jac1(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac1.row(1).transpose();
  G_jac1(0,2) += temp;
  temp = -R_jac1.row(2)*yyF*R.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac1.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = -2.0*R_jac1.row(1)*zxF*R.row(1).transpose();
  G_jac1(0,2) += temp;
  temp = R_jac1.row(1)*yzF*R.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = R.row(1)*yzF*R_jac1.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(1).transpose();
  G_jac2(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac2.row(1).transpose();
  G_jac2(0,2) += temp;
  temp = -R_jac2.row(2)*yyF*R.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac2.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = -2.0*R_jac2.row(1)*zxF*R.row(1).transpose();
  G_jac2(0,2) += temp;
  temp = R_jac2.row(1)*yzF*R.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = R.row(1)*yzF*R_jac2.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(1).transpose();
  G_jac3(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac3.row(1).transpose();
  G_jac3(0,2) += temp;
  temp = -R_jac3.row(2)*yyF*R.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac3.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = -2.0*R_jac3.row(1)*zxF*R.row(1).transpose();
  G_jac3(0,2) += temp;
  temp = R_jac3.row(1)*yzF*R.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = R.row(1)*yzF*R_jac3.row(0).transpose();
  G_jac3(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  G(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  G(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  G(1,1) += temp;
  temp = 2.0*R_jac1.row(0)*zzF*R.row(0).transpose();
  G_jac1(1,1)  = temp;
  temp = -2.0*R_jac1.row(0)*zxF*R.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac1.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = 2.0*R_jac1.row(2)*xxF*R.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = 2.0*R_jac2.row(0)*zzF*R.row(0).transpose();
  G_jac2(1,1)  = temp;
  temp = -2.0*R_jac2.row(0)*zxF*R.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac2.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = 2.0*R_jac2.row(2)*xxF*R.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = 2.0*R_jac3.row(0)*zzF*R.row(0).transpose();
  G_jac3(1,1)  = temp;
  temp = -2.0*R_jac3.row(0)*zxF*R.row(2).transpose();
  G_jac3(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac3.row(2).transpose();
  G_jac3(1,1) += temp;
  temp = 2.0*R_jac3.row(2)*xxF*R.row(2).transpose();
  G_jac3(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  G(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  G(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  G(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  G(1,2) += temp;
  temp = R_jac1.row(0)*zxF*R.row(1).transpose();
  G_jac1(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac1.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = -2.0*R_jac1.row(0)*yzF*R.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = -R_jac1.row(2)*xxF*R.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac1.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = R.row(2)*xyF*R_jac1.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = R_jac2.row(0)*zxF*R.row(1).transpose();
  G_jac2(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac2.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = -2.0*R_jac2.row(0)*yzF*R.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = -R_jac2.row(2)*xxF*R.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac2.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = R.row(2)*xyF*R_jac2.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = R_jac3.row(0)*zxF*R.row(1).transpose();
  G_jac3(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac3.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = -2.0*R_jac3.row(0)*yzF*R.row(0).transpose();
  G_jac3(1,2) += temp;
  temp = -R_jac3.row(2)*xxF*R.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac3.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(0).transpose();
  G_jac3(1,2) += temp;
  temp = R.row(2)*xyF*R_jac3.row(0).transpose();
  G_jac3(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  G(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  G(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  G(2,2) += temp;
  temp = 2.0*R_jac1.row(1)*xxF*R.row(1).transpose();
  G_jac1(2,2)  = temp;
  temp = -2.0*R_jac1.row(0)*xyF*R.row(1).transpose();
  G_jac1(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac1.row(1).transpose();
  G_jac1(2,2) += temp;
  temp = 2.0*R_jac1.row(0)*yyF*R.row(0).transpose();
  G_jac1(2,2) += temp;
  temp = 2.0*R_jac2.row(1)*xxF*R.row(1).transpose();
  G_jac2(2,2)  = temp;
  temp = -2.0*R_jac2.row(0)*xyF*R.row(1).transpose();
  G_jac2(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac2.row(1).transpose();
  G_jac2(2,2) += temp;
  temp = 2.0*R_jac2.row(0)*yyF*R.row(0).transpose();
  G_jac2(2,2) += temp;
  temp = 2.0*R_jac3.row(1)*xxF*R.row(1).transpose();
  G_jac3(2,2)  = temp;
  temp = -2.0*R_jac3.row(0)*xyF*R.row(1).transpose();
  G_jac3(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac3.row(1).transpose();
  G_jac3(2,2) += temp;
  temp = 2.0*R_jac3.row(0)*yyF*R.row(0).transpose();
  G_jac3(2,2) += temp;

  G(1,0) = G(0,1);
  G(2,0) = G(0,2);
  G(2,1) = G(1,2);
  G_jac1(1,0) = G_jac1(0,1);
  G_jac1(2,0) = G_jac1(0,2);
  G_jac1(2,1) = G_jac1(1,2);
  G_jac2(1,0) = G_jac2(0,1);
  G_jac2(2,0) = G_jac2(0,2);
  G_jac2(2,1) = G_jac2(1,2);
  G_jac3(1,0) = G_jac3(0,1);
  G_jac3(2,0) = G_jac3(0,2);
  G_jac3(2,1) = G_jac3(1,2);

  //the generalized terms:
  Eigen::Matrix<double,1,9> Rows;
  Rows.block<1,3>(0,0) = R.row(0);
  Rows.block<1,3>(0,3) = R.row(1);
  Rows.block<1,3>(0,6) = R.row(2);
  
  Eigen::Matrix<double,9,1> Cols;
  Cols.block<3,1>(0,0) = R.col(0);
  Cols.block<3,1>(3,0) = R.col(1);
  Cols.block<3,1>(6,0) = R.col(2);
  
  Eigen::Matrix<double,1,9> Rows_jac1;
  Rows_jac1.block<1,3>(0,0) = R_jac1.row(0);
  Rows_jac1.block<1,3>(0,3) = R_jac1.row(1);
  Rows_jac1.block<1,3>(0,6) = R_jac1.row(2);
  Eigen::Matrix<double,1,9> Rows_jac2;
  Rows_jac2.block<1,3>(0,0) = R_jac2.row(0);
  Rows_jac2.block<1,3>(0,3) = R_jac2.row(1);
  Rows_jac2.block<1,3>(0,6) = R_jac2.row(2);
  Eigen::Matrix<double,1,9> Rows_jac3;
  Rows_jac3.block<1,3>(0,0) = R_jac3.row(0);
  Rows_jac3.block<1,3>(0,3) = R_jac3.row(1);
  Rows_jac3.block<1,3>(0,6) = R_jac3.row(2);
  
  Eigen::Matrix<double,9,1> Cols_jac1;
  Cols_jac1.block<3,1>(0,0) = R_jac1.col(0);
  Cols_jac1.block<3,1>(3,0) = R_jac1.col(1);
  Cols_jac1.block<3,1>(6,0) = R_jac1.col(2);
  Eigen::Matrix<double,9,1> Cols_jac2;
  Cols_jac2.block<3,1>(0,0) = R_jac2.col(0);
  Cols_jac2.block<3,1>(3,0) = R_jac2.col(1);
  Cols_jac2.block<3,1>(6,0) = R_jac2.col(2);
  Eigen::Matrix<double,9,1> Cols_jac3;
  Cols_jac3.block<3,1>(0,0) = R_jac3.col(0);
  Cols_jac3.block<3,1>(3,0) = R_jac3.col(1);
  Cols_jac3.block<3,1>(6,0) = R_jac3.col(2);
  
  temp =      R.row(2)*y1P*Cols;
  G(0,3)  = temp;
  temp =      R.row(2)*y2P*Rows.transpose();
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows.transpose();
  G(0,3) += temp;
  temp =      R_jac1.row(2)*y1P*Cols;
  G_jac1(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac1;
  G_jac1(0,3) += temp;
  temp =      R_jac1.row(2)*y2P*Rows.transpose();
  G_jac1(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac1.transpose();
  G_jac1(0,3) += temp;
  temp = -1.0*R_jac1.row(1)*z1P*Cols;
  G_jac1(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac1;
  G_jac1(0,3) += temp;
  temp = -1.0*R_jac1.row(1)*z2P*Rows.transpose();
  G_jac1(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac1.transpose();
  G_jac1(0,3) += temp;
  temp =      R_jac2.row(2)*y1P*Cols;
  G_jac2(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac2;
  G_jac2(0,3) += temp;
  temp =      R_jac2.row(2)*y2P*Rows.transpose();
  G_jac2(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac2.transpose();
  G_jac2(0,3) += temp;
  temp = -1.0*R_jac2.row(1)*z1P*Cols;
  G_jac2(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac2;
  G_jac2(0,3) += temp;
  temp = -1.0*R_jac2.row(1)*z2P*Rows.transpose();
  G_jac2(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac2.transpose();
  G_jac2(0,3) += temp;
  temp =      R_jac3.row(2)*y1P*Cols;
  G_jac3(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac3;
  G_jac3(0,3) += temp;
  temp =      R_jac3.row(2)*y2P*Rows.transpose();
  G_jac3(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac3.transpose();
  G_jac3(0,3) += temp;
  temp = -1.0*R_jac3.row(1)*z1P*Cols;
  G_jac3(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac3;
  G_jac3(0,3) += temp;
  temp = -1.0*R_jac3.row(1)*z2P*Rows.transpose();
  G_jac3(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac3.transpose();
  G_jac3(0,3) += temp;
  
  temp =      R.row(0)*z1P*Cols;
  G(1,3)  = temp;
  temp =      R.row(0)*z2P*Rows.transpose();
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows.transpose();
  G(1,3) += temp;
  temp =      R_jac1.row(0)*z1P*Cols;
  G_jac1(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac1;
  G_jac1(1,3) += temp;
  temp =      R_jac1.row(0)*z2P*Rows.transpose();
  G_jac1(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac1.transpose();
  G_jac1(1,3) += temp;
  temp = -1.0*R_jac1.row(2)*x1P*Cols;
  G_jac1(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac1;
  G_jac1(1,3) += temp;
  temp = -1.0*R_jac1.row(2)*x2P*Rows.transpose();
  G_jac1(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac1.transpose();
  G_jac1(1,3) += temp;
  temp =      R_jac2.row(0)*z1P*Cols;
  G_jac2(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac2;
  G_jac2(1,3) += temp;
  temp =      R_jac2.row(0)*z2P*Rows.transpose();
  G_jac2(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac2.transpose();
  G_jac2(1,3) += temp;
  temp = -1.0*R_jac2.row(2)*x1P*Cols;
  G_jac2(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac2;
  G_jac2(1,3) += temp;
  temp = -1.0*R_jac2.row(2)*x2P*Rows.transpose();
  G_jac2(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac2.transpose();
  G_jac2(1,3) += temp;
  temp =      R_jac3.row(0)*z1P*Cols;
  G_jac3(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac3;
  G_jac3(1,3) += temp;
  temp =      R_jac3.row(0)*z2P*Rows.transpose();
  G_jac3(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac3.transpose();
  G_jac3(1,3) += temp;
  temp = -1.0*R_jac3.row(2)*x1P*Cols;
  G_jac3(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac3;
  G_jac3(1,3) += temp;
  temp = -1.0*R_jac3.row(2)*x2P*Rows.transpose();
  G_jac3(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac3.transpose();
  G_jac3(1,3) += temp;
  
  temp =      R.row(1)*x1P*Cols;
  G(2,3)  = temp;
  temp =      R.row(1)*x2P*Rows.transpose();
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows.transpose();
  G(2,3) += temp;
  temp =      R_jac1.row(1)*x1P*Cols;
  G_jac1(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac1;
  G_jac1(2,3) += temp;
  temp =      R_jac1.row(1)*x2P*Rows.transpose();
  G_jac1(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac1.transpose();
  G_jac1(2,3) += temp;
  temp = -1.0*R_jac1.row(0)*y1P*Cols;
  G_jac1(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac1;
  G_jac1(2,3) += temp;
  temp = -1.0*R_jac1.row(0)*y2P*Rows.transpose();
  G_jac1(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac1.transpose();
  G_jac1(2,3) += temp;
  temp =      R_jac2.row(1)*x1P*Cols;
  G_jac2(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac2;
  G_jac2(2,3) += temp;
  temp =      R_jac2.row(1)*x2P*Rows.transpose();
  G_jac2(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac2.transpose();
  G_jac2(2,3) += temp;
  temp = -1.0*R_jac2.row(0)*y1P*Cols;
  G_jac2(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac2;
  G_jac2(2,3) += temp;
  temp = -1.0*R_jac2.row(0)*y2P*Rows.transpose();
  G_jac2(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac2.transpose();
  G_jac2(2,3) += temp;
  temp =      R_jac3.row(1)*x1P*Cols;
  G_jac3(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac3;
  G_jac3(2,3) += temp;
  temp =      R_jac3.row(1)*x2P*Rows.transpose();
  G_jac3(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac3.transpose();
  G_jac3(2,3) += temp;
  temp = -1.0*R_jac3.row(0)*y1P*Cols;
  G_jac3(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac3;
  G_jac3(2,3) += temp;
  temp = -1.0*R_jac3.row(0)*y2P*Rows.transpose();
  G_jac3(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac3.transpose();
  G_jac3(2,3) += temp;
  
  temp = -1.0*Cols.transpose()*m11P*Cols;
  G(3,3)  = temp;
  temp = -1.0*Rows*m22P*Rows.transpose();
  G(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols;
  G(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac1;
  G_jac1(3,3)  = temp;
  temp = -2.0*Rows_jac1*m22P*Rows.transpose();
  G_jac1(3,3) += temp;
  temp = -2.0*Rows_jac1*m12P*Cols;
  G_jac1(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac1;
  G_jac1(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac2;
  G_jac2(3,3)  = temp;
  temp = -2.0*Rows_jac2*m22P*Rows.transpose();
  G_jac2(3,3) += temp;
  temp = -2.0*Rows_jac2*m12P*Cols;
  G_jac2(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac2;
  G_jac2(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac3;
  G_jac3(3,3)  = temp;
  temp = -2.0*Rows_jac3*m22P*Rows.transpose();
  G_jac3(3,3) += temp;
  temp = -2.0*Rows_jac3*m12P*Cols;
  G_jac3(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac3;
  G_jac3(3,3) += temp;
  
  G(3,0) = G(0,3);
  G(3,1) = G(1,3);
  G(3,2) = G(2,3);
  G_jac1(3,0) = G_jac1(0,3);
  G_jac1(3,1) = G_jac1(1,3);
  G_jac1(3,2) = G_jac1(2,3);
  G_jac2(3,0) = G_jac2(0,3);
  G_jac2(3,1) = G_jac2(1,3);
  G_jac2(3,2) = G_jac2(2,3);
  G_jac3(3,0) = G_jac3(0,3);
  G_jac3(3,1) = G_jac3(1,3);
  G_jac3(3,2) = G_jac3(2,3);

  return G;
}